

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiMBIntersectorK<4,8>::
     occluded_t<embree::avx512::RibbonCurve1IntersectorK<embree::BezierCurveT,8,8>,embree::avx512::Occluded1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  Primitive PVar6;
  uint uVar7;
  int iVar8;
  Geometry *pGVar9;
  __int_type_conflict _Var10;
  RTCFilterFunctionN p_Var11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined8 uVar26;
  long lVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  byte bVar61;
  ulong uVar62;
  long lVar63;
  long lVar64;
  ulong uVar65;
  ulong uVar66;
  ulong uVar67;
  uint uVar68;
  Geometry *geometry;
  long lVar69;
  ulong uVar70;
  byte bVar71;
  float fVar72;
  float fVar73;
  float fVar120;
  float fVar122;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  float fVar121;
  float fVar123;
  float fVar124;
  float fVar125;
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  float fVar126;
  float fVar127;
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  float fVar128;
  undefined4 uVar129;
  float fVar138;
  vint4 bi_2;
  undefined1 auVar130 [16];
  float fVar139;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined8 uVar140;
  vint4 bi_1;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [32];
  vint4 bi;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  float fVar151;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  vint4 ai_2;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  vint4 ai_1;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  float fVar173;
  float fVar174;
  float fVar177;
  vint4 ai;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [32];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [32];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [32];
  undefined1 auVar189 [16];
  undefined1 auVar190 [32];
  undefined1 auVar191 [16];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [64];
  undefined1 auVar195 [64];
  undefined1 auVar196 [64];
  undefined1 auVar197 [64];
  undefined1 auVar198 [64];
  undefined1 auVar199 [64];
  undefined1 auVar200 [64];
  undefined1 auVar201 [64];
  undefined1 auVar202 [64];
  undefined1 auVar203 [64];
  undefined1 auVar204 [64];
  undefined1 auVar205 [64];
  RTCFilterFunctionNArguments args;
  float old_t;
  float old_t_1;
  RTCFilterFunctionNArguments local_6d0;
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_650 [16];
  undefined1 local_640 [16];
  undefined1 local_630 [16];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  LinearSpace3fa *local_570;
  Primitive *local_568;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4b0 [8];
  float fStack_4a8;
  float fStack_4a4;
  uint local_4a0;
  uint uStack_49c;
  uint uStack_498;
  uint uStack_494;
  uint uStack_490;
  uint uStack_48c;
  uint uStack_488;
  uint uStack_484;
  float local_480;
  float fStack_47c;
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined4 local_360;
  int local_35c;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  float local_300 [4];
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined4 local_260;
  undefined4 uStack_25c;
  undefined4 uStack_258;
  undefined4 uStack_254;
  undefined4 uStack_250;
  undefined4 uStack_24c;
  undefined4 uStack_248;
  undefined4 uStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  float local_200;
  float fStack_1fc;
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined4 local_1e0;
  undefined4 uStack_1dc;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined1 local_1a0 [32];
  uint local_180;
  uint uStack_17c;
  uint uStack_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  uint local_160;
  uint uStack_15c;
  uint uStack_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  uint uStack_148;
  uint uStack_144;
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined4 uStack_c4;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar6 = prim[1];
  uVar62 = (ulong)(byte)PVar6;
  lVar27 = uVar62 * 0x25;
  fVar128 = *(float *)(prim + lVar27 + 0x12);
  auVar78 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar78 = vinsertps_avx(auVar78,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar77 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar77 = vinsertps_avx(auVar77,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar78 = vsubps_avx(auVar78,*(undefined1 (*) [16])(prim + lVar27 + 6));
  auVar152._0_4_ = fVar128 * auVar78._0_4_;
  auVar152._4_4_ = fVar128 * auVar78._4_4_;
  auVar152._8_4_ = fVar128 * auVar78._8_4_;
  auVar152._12_4_ = fVar128 * auVar78._12_4_;
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 4 + 6)));
  auVar130._0_4_ = fVar128 * auVar77._0_4_;
  auVar130._4_4_ = fVar128 * auVar77._4_4_;
  auVar130._8_4_ = fVar128 * auVar77._8_4_;
  auVar130._12_4_ = fVar128 * auVar77._12_4_;
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar77 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 5 + 6)));
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 6 + 6)));
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 0xf + 6)));
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar62 + 6)));
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 0x1a + 6)));
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar24 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 0x1b + 6)));
  auVar24 = vcvtdq2ps_avx(auVar24);
  auVar25 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar62 * 0x1c + 6)));
  auVar25 = vcvtdq2ps_avx(auVar25);
  auVar166._4_4_ = auVar130._0_4_;
  auVar166._0_4_ = auVar130._0_4_;
  auVar166._8_4_ = auVar130._0_4_;
  auVar166._12_4_ = auVar130._0_4_;
  auVar80 = vshufps_avx(auVar130,auVar130,0x55);
  auVar81 = vshufps_avx(auVar130,auVar130,0xaa);
  fVar128 = auVar81._0_4_;
  auVar146._0_4_ = fVar128 * auVar79._0_4_;
  fVar151 = auVar81._4_4_;
  auVar146._4_4_ = fVar151 * auVar79._4_4_;
  fVar138 = auVar81._8_4_;
  auVar146._8_4_ = fVar138 * auVar79._8_4_;
  fVar139 = auVar81._12_4_;
  auVar146._12_4_ = fVar139 * auVar79._12_4_;
  auVar141._0_4_ = auVar22._0_4_ * fVar128;
  auVar141._4_4_ = auVar22._4_4_ * fVar151;
  auVar141._8_4_ = auVar22._8_4_ * fVar138;
  auVar141._12_4_ = auVar22._12_4_ * fVar139;
  auVar131._0_4_ = auVar25._0_4_ * fVar128;
  auVar131._4_4_ = auVar25._4_4_ * fVar151;
  auVar131._8_4_ = auVar25._8_4_ * fVar138;
  auVar131._12_4_ = auVar25._12_4_ * fVar139;
  auVar81 = vfmadd231ps_fma(auVar146,auVar80,auVar77);
  auVar29 = vfmadd231ps_fma(auVar141,auVar80,auVar21);
  auVar80 = vfmadd231ps_fma(auVar131,auVar24,auVar80);
  auVar82 = vfmadd231ps_fma(auVar81,auVar166,auVar78);
  auVar29 = vfmadd231ps_fma(auVar29,auVar166,auVar20);
  auVar30 = vfmadd231ps_fma(auVar80,auVar23,auVar166);
  auVar189._4_4_ = auVar152._0_4_;
  auVar189._0_4_ = auVar152._0_4_;
  auVar189._8_4_ = auVar152._0_4_;
  auVar189._12_4_ = auVar152._0_4_;
  auVar80 = vshufps_avx(auVar152,auVar152,0x55);
  auVar81 = vshufps_avx(auVar152,auVar152,0xaa);
  fVar128 = auVar81._0_4_;
  auVar167._0_4_ = fVar128 * auVar79._0_4_;
  fVar151 = auVar81._4_4_;
  auVar167._4_4_ = fVar151 * auVar79._4_4_;
  fVar138 = auVar81._8_4_;
  auVar167._8_4_ = fVar138 * auVar79._8_4_;
  fVar139 = auVar81._12_4_;
  auVar167._12_4_ = fVar139 * auVar79._12_4_;
  auVar158._0_4_ = auVar22._0_4_ * fVar128;
  auVar158._4_4_ = auVar22._4_4_ * fVar151;
  auVar158._8_4_ = auVar22._8_4_ * fVar138;
  auVar158._12_4_ = auVar22._12_4_ * fVar139;
  auVar153._0_4_ = auVar25._0_4_ * fVar128;
  auVar153._4_4_ = auVar25._4_4_ * fVar151;
  auVar153._8_4_ = auVar25._8_4_ * fVar138;
  auVar153._12_4_ = auVar25._12_4_ * fVar139;
  auVar77 = vfmadd231ps_fma(auVar167,auVar80,auVar77);
  auVar79 = vfmadd231ps_fma(auVar158,auVar80,auVar21);
  auVar21 = vfmadd231ps_fma(auVar153,auVar80,auVar24);
  auVar31 = vfmadd231ps_fma(auVar77,auVar189,auVar78);
  auVar130 = vfmadd231ps_fma(auVar79,auVar189,auVar20);
  auVar181._8_4_ = 0x7fffffff;
  auVar181._0_8_ = 0x7fffffff7fffffff;
  auVar181._12_4_ = 0x7fffffff;
  auVar131 = vfmadd231ps_fma(auVar21,auVar189,auVar23);
  auVar78 = vandps_avx(auVar181,auVar82);
  auVar178._8_4_ = 0x219392ef;
  auVar178._0_8_ = 0x219392ef219392ef;
  auVar178._12_4_ = 0x219392ef;
  uVar70 = vcmpps_avx512vl(auVar78,auVar178,1);
  bVar12 = (bool)((byte)uVar70 & 1);
  auVar74._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar82._0_4_;
  bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
  auVar74._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar82._4_4_;
  bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
  auVar74._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar82._8_4_;
  bVar12 = (bool)((byte)(uVar70 >> 3) & 1);
  auVar74._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar82._12_4_;
  auVar78 = vandps_avx(auVar181,auVar29);
  uVar70 = vcmpps_avx512vl(auVar78,auVar178,1);
  bVar12 = (bool)((byte)uVar70 & 1);
  auVar75._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar29._0_4_;
  bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
  auVar75._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar29._4_4_;
  bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
  auVar75._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar29._8_4_;
  bVar12 = (bool)((byte)(uVar70 >> 3) & 1);
  auVar75._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar29._12_4_;
  auVar78 = vandps_avx(auVar181,auVar30);
  uVar70 = vcmpps_avx512vl(auVar78,auVar178,1);
  bVar12 = (bool)((byte)uVar70 & 1);
  auVar76._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar30._0_4_;
  bVar12 = (bool)((byte)(uVar70 >> 1) & 1);
  auVar76._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar30._4_4_;
  bVar12 = (bool)((byte)(uVar70 >> 2) & 1);
  auVar76._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar30._8_4_;
  bVar12 = (bool)((byte)(uVar70 >> 3) & 1);
  auVar76._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar30._12_4_;
  auVar77 = vrcp14ps_avx512vl(auVar74);
  auVar179._8_4_ = 0x3f800000;
  auVar179._0_8_ = 0x3f8000003f800000;
  auVar179._12_4_ = 0x3f800000;
  auVar78 = vfnmadd213ps_fma(auVar74,auVar77,auVar179);
  auVar82 = vfmadd132ps_fma(auVar78,auVar77,auVar77);
  auVar77 = vrcp14ps_avx512vl(auVar75);
  auVar78 = vfnmadd213ps_fma(auVar75,auVar77,auVar179);
  auVar30 = vfmadd132ps_fma(auVar78,auVar77,auVar77);
  auVar77 = vrcp14ps_avx512vl(auVar76);
  auVar78 = vfnmadd213ps_fma(auVar76,auVar77,auVar179);
  auVar28 = vfmadd132ps_fma(auVar78,auVar77,auVar77);
  fVar128 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar27 + 0x16)) *
            *(float *)(prim + lVar27 + 0x1a);
  auVar175._4_4_ = fVar128;
  auVar175._0_4_ = fVar128;
  auVar175._8_4_ = fVar128;
  auVar175._12_4_ = fVar128;
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar62 * 7 + 6);
  auVar78 = vpmovsxwd_avx(auVar78);
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar62 * 0xb + 6);
  auVar77 = vpmovsxwd_avx(auVar77);
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar20 = vsubps_avx(auVar77,auVar78);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar62 * 9 + 6);
  auVar77 = vpmovsxwd_avx(auVar79);
  auVar79 = vfmadd213ps_fma(auVar20,auVar175,auVar78);
  auVar78 = vcvtdq2ps_avx(auVar77);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar62 * 0xd + 6);
  auVar77 = vpmovsxwd_avx(auVar20);
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar77 = vsubps_avx(auVar77,auVar78);
  auVar20 = vfmadd213ps_fma(auVar77,auVar175,auVar78);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar62 * 0x12 + 6);
  auVar78 = vpmovsxwd_avx(auVar21);
  auVar78 = vcvtdq2ps_avx(auVar78);
  uVar70 = (ulong)(uint)((int)(uVar62 * 5) << 2);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar62 * 2 + uVar70 + 6);
  auVar77 = vpmovsxwd_avx(auVar22);
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar77 = vsubps_avx(auVar77,auVar78);
  auVar21 = vfmadd213ps_fma(auVar77,auVar175,auVar78);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar70 + 6);
  auVar78 = vpmovsxwd_avx(auVar23);
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar62 * 0x18 + 6);
  auVar77 = vpmovsxwd_avx(auVar24);
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar77 = vsubps_avx(auVar77,auVar78);
  auVar22 = vfmadd213ps_fma(auVar77,auVar175,auVar78);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + uVar62 * 0x1d + 6);
  auVar78 = vpmovsxwd_avx(auVar25);
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar62 + (ulong)(byte)PVar6 * 0x20 + 6);
  auVar77 = vpmovsxwd_avx(auVar80);
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar77 = vsubps_avx(auVar77,auVar78);
  auVar23 = vfmadd213ps_fma(auVar77,auVar175,auVar78);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar6 * 0x20 - uVar62) + 6);
  auVar78 = vpmovsxwd_avx(auVar81);
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *(ulong *)(prim + uVar62 * 0x23 + 6);
  auVar77 = vpmovsxwd_avx(auVar29);
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar77 = vsubps_avx(auVar77,auVar78);
  auVar77 = vfmadd213ps_fma(auVar77,auVar175,auVar78);
  auVar78 = vsubps_avx(auVar79,auVar31);
  auVar176._0_4_ = auVar82._0_4_ * auVar78._0_4_;
  auVar176._4_4_ = auVar82._4_4_ * auVar78._4_4_;
  auVar176._8_4_ = auVar82._8_4_ * auVar78._8_4_;
  auVar176._12_4_ = auVar82._12_4_ * auVar78._12_4_;
  auVar78 = vsubps_avx(auVar20,auVar31);
  auVar147._0_4_ = auVar82._0_4_ * auVar78._0_4_;
  auVar147._4_4_ = auVar82._4_4_ * auVar78._4_4_;
  auVar147._8_4_ = auVar82._8_4_ * auVar78._8_4_;
  auVar147._12_4_ = auVar82._12_4_ * auVar78._12_4_;
  auVar78 = vsubps_avx(auVar21,auVar130);
  auVar168._0_4_ = auVar30._0_4_ * auVar78._0_4_;
  auVar168._4_4_ = auVar30._4_4_ * auVar78._4_4_;
  auVar168._8_4_ = auVar30._8_4_ * auVar78._8_4_;
  auVar168._12_4_ = auVar30._12_4_ * auVar78._12_4_;
  auVar78 = vsubps_avx(auVar22,auVar130);
  auVar142._0_4_ = auVar30._0_4_ * auVar78._0_4_;
  auVar142._4_4_ = auVar30._4_4_ * auVar78._4_4_;
  auVar142._8_4_ = auVar30._8_4_ * auVar78._8_4_;
  auVar142._12_4_ = auVar30._12_4_ * auVar78._12_4_;
  auVar78 = vsubps_avx(auVar23,auVar131);
  auVar159._0_4_ = auVar28._0_4_ * auVar78._0_4_;
  auVar159._4_4_ = auVar28._4_4_ * auVar78._4_4_;
  auVar159._8_4_ = auVar28._8_4_ * auVar78._8_4_;
  auVar159._12_4_ = auVar28._12_4_ * auVar78._12_4_;
  auVar78 = vsubps_avx(auVar77,auVar131);
  auVar132._0_4_ = auVar28._0_4_ * auVar78._0_4_;
  auVar132._4_4_ = auVar28._4_4_ * auVar78._4_4_;
  auVar132._8_4_ = auVar28._8_4_ * auVar78._8_4_;
  auVar132._12_4_ = auVar28._12_4_ * auVar78._12_4_;
  auVar78 = vpminsd_avx(auVar176,auVar147);
  auVar77 = vpminsd_avx(auVar168,auVar142);
  auVar78 = vmaxps_avx(auVar78,auVar77);
  auVar77 = vpminsd_avx(auVar159,auVar132);
  uVar129 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar82._4_4_ = uVar129;
  auVar82._0_4_ = uVar129;
  auVar82._8_4_ = uVar129;
  auVar82._12_4_ = uVar129;
  auVar77 = vmaxps_avx512vl(auVar77,auVar82);
  auVar78 = vmaxps_avx(auVar78,auVar77);
  auVar30._8_4_ = 0x3f7ffffa;
  auVar30._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar30._12_4_ = 0x3f7ffffa;
  local_3d0 = vmulps_avx512vl(auVar78,auVar30);
  auVar78 = vpmaxsd_avx(auVar176,auVar147);
  auVar77 = vpmaxsd_avx(auVar168,auVar142);
  auVar78 = vminps_avx(auVar78,auVar77);
  auVar77 = vpmaxsd_avx(auVar159,auVar132);
  uVar129 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar28._4_4_ = uVar129;
  auVar28._0_4_ = uVar129;
  auVar28._8_4_ = uVar129;
  auVar28._12_4_ = uVar129;
  auVar77 = vminps_avx512vl(auVar77,auVar28);
  auVar78 = vminps_avx(auVar78,auVar77);
  auVar31._8_4_ = 0x3f800003;
  auVar31._0_8_ = 0x3f8000033f800003;
  auVar31._12_4_ = 0x3f800003;
  auVar78 = vmulps_avx512vl(auVar78,auVar31);
  auVar77 = vpbroadcastd_avx512vl();
  uVar140 = vcmpps_avx512vl(local_3d0,auVar78,2);
  uVar70 = vpcmpgtd_avx512vl(auVar77,_DAT_01f7fcf0);
  uVar70 = ((byte)uVar140 & 0xf) & uVar70;
  if ((char)uVar70 == '\0') {
    bVar71 = 0;
  }
  else {
    local_570 = pre->ray_space + k;
    local_280 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    local_568 = prim;
    do {
      lVar27 = 0;
      for (uVar62 = uVar70; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x8000000000000000) {
        lVar27 = lVar27 + 1;
      }
      uVar7 = *(uint *)(local_568 + 2);
      pGVar9 = (context->scene->geometries).items[uVar7].ptr;
      local_440._0_8_ = CONCAT44(0,*(uint *)(local_568 + lVar27 * 4 + 6));
      uVar62 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                               CONCAT44(0,*(uint *)(local_568 + lVar27 * 4 + 6)) *
                               pGVar9[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar128 = (pGVar9->time_range).lower;
      fVar128 = pGVar9->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0xe0) - fVar128) / ((pGVar9->time_range).upper - fVar128)
                );
      auVar78 = vroundss_avx(ZEXT416((uint)fVar128),ZEXT416((uint)fVar128),9);
      auVar78 = vminss_avx(auVar78,ZEXT416((uint)(pGVar9->fnumTimeSegments + -1.0)));
      auVar78 = vmaxss_avx(ZEXT816(0) << 0x20,auVar78);
      fVar128 = fVar128 - auVar78._0_4_;
      _Var10 = pGVar9[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar64 = (long)(int)auVar78._0_4_ * 0x38;
      lVar27 = *(long *)(_Var10 + 0x10 + lVar64);
      lVar69 = *(long *)(_Var10 + 0x38 + lVar64);
      lVar63 = *(long *)(_Var10 + 0x48 + lVar64);
      auVar143._4_4_ = fVar128;
      auVar143._0_4_ = fVar128;
      auVar143._8_4_ = fVar128;
      auVar143._12_4_ = fVar128;
      pfVar3 = (float *)(lVar69 + uVar62 * lVar63);
      auVar182._0_4_ = fVar128 * *pfVar3;
      auVar182._4_4_ = fVar128 * pfVar3[1];
      auVar182._8_4_ = fVar128 * pfVar3[2];
      auVar182._12_4_ = fVar128 * pfVar3[3];
      pfVar3 = (float *)(lVar69 + (uVar62 + 1) * lVar63);
      auVar183._0_4_ = fVar128 * *pfVar3;
      auVar183._4_4_ = fVar128 * pfVar3[1];
      auVar183._8_4_ = fVar128 * pfVar3[2];
      auVar183._12_4_ = fVar128 * pfVar3[3];
      uVar65 = (uVar62 + 2) * lVar63;
      auVar78 = vmulps_avx512vl(auVar143,*(undefined1 (*) [16])(lVar69 + uVar65));
      auVar77 = vmulps_avx512vl(auVar143,*(undefined1 (*) [16])(lVar69 + lVar63 * (uVar62 + 3)));
      lVar69 = *(long *)(_Var10 + lVar64);
      fVar128 = 1.0 - fVar128;
      auVar133._4_4_ = fVar128;
      auVar133._0_4_ = fVar128;
      auVar133._8_4_ = fVar128;
      auVar133._12_4_ = fVar128;
      local_630 = vfmadd231ps_fma(auVar182,auVar133,*(undefined1 (*) [16])(lVar69 + lVar27 * uVar62)
                                 );
      local_640 = vfmadd231ps_fma(auVar183,auVar133,
                                  *(undefined1 (*) [16])(lVar69 + lVar27 * (uVar62 + 1)));
      local_650 = vfmadd231ps_avx512vl
                            (auVar78,auVar133,*(undefined1 (*) [16])(lVar69 + lVar27 * (uVar62 + 2))
                            );
      _local_4b0 = vfmadd231ps_avx512vl
                             (auVar77,auVar133,
                              *(undefined1 (*) [16])(lVar69 + lVar27 * (uVar62 + 3)));
      iVar8 = (int)pGVar9[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar78 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20))
                              ,0x1c);
      lVar27 = (long)iVar8 * 0x44;
      auVar78 = vinsertps_avx(auVar78,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      auVar79 = vsubps_avx(local_630,auVar78);
      uVar129 = auVar79._0_4_;
      auVar148._4_4_ = uVar129;
      auVar148._0_4_ = uVar129;
      auVar148._8_4_ = uVar129;
      auVar148._12_4_ = uVar129;
      auVar77 = vshufps_avx(auVar79,auVar79,0x55);
      aVar4 = (local_570->vx).field_0;
      aVar5 = (local_570->vy).field_0;
      fVar128 = (local_570->vz).field_0.m128[0];
      fVar151 = *(float *)((long)&(local_570->vz).field_0 + 4);
      fVar138 = *(float *)((long)&(local_570->vz).field_0 + 8);
      fVar139 = *(float *)((long)&(local_570->vz).field_0 + 0xc);
      auVar79 = vshufps_avx(auVar79,auVar79,0xaa);
      auVar185._0_4_ = fVar128 * auVar79._0_4_;
      auVar185._4_4_ = fVar151 * auVar79._4_4_;
      auVar185._8_4_ = fVar138 * auVar79._8_4_;
      auVar185._12_4_ = fVar139 * auVar79._12_4_;
      auVar77 = vfmadd231ps_fma(auVar185,(undefined1  [16])aVar5,auVar77);
      auVar20 = vfmadd231ps_fma(auVar77,(undefined1  [16])aVar4,auVar148);
      auVar79 = vsubps_avx(local_640,auVar78);
      uVar129 = auVar79._0_4_;
      auVar149._4_4_ = uVar129;
      auVar149._0_4_ = uVar129;
      auVar149._8_4_ = uVar129;
      auVar149._12_4_ = uVar129;
      auVar77 = vshufps_avx(auVar79,auVar79,0x55);
      auVar79 = vshufps_avx(auVar79,auVar79,0xaa);
      auVar186._0_4_ = fVar128 * auVar79._0_4_;
      auVar186._4_4_ = fVar151 * auVar79._4_4_;
      auVar186._8_4_ = fVar138 * auVar79._8_4_;
      auVar186._12_4_ = fVar139 * auVar79._12_4_;
      auVar77 = vfmadd231ps_fma(auVar186,(undefined1  [16])aVar5,auVar77);
      auVar21 = vfmadd231ps_fma(auVar77,(undefined1  [16])aVar4,auVar149);
      auVar79 = vsubps_avx512vl(local_650,auVar78);
      uVar129 = auVar79._0_4_;
      auVar150._4_4_ = uVar129;
      auVar150._0_4_ = uVar129;
      auVar150._8_4_ = uVar129;
      auVar150._12_4_ = uVar129;
      auVar77 = vshufps_avx(auVar79,auVar79,0x55);
      auVar79 = vshufps_avx(auVar79,auVar79,0xaa);
      auVar187._0_4_ = fVar128 * auVar79._0_4_;
      auVar187._4_4_ = fVar151 * auVar79._4_4_;
      auVar187._8_4_ = fVar138 * auVar79._8_4_;
      auVar187._12_4_ = fVar139 * auVar79._12_4_;
      auVar77 = vfmadd231ps_fma(auVar187,(undefined1  [16])aVar5,auVar77);
      auVar79 = vfmadd231ps_fma(auVar77,(undefined1  [16])aVar4,auVar150);
      auVar77 = vsubps_avx512vl(_local_4b0,auVar78);
      uVar129 = auVar77._0_4_;
      auVar144._4_4_ = uVar129;
      auVar144._0_4_ = uVar129;
      auVar144._8_4_ = uVar129;
      auVar144._12_4_ = uVar129;
      auVar78 = vshufps_avx(auVar77,auVar77,0x55);
      auVar77 = vshufps_avx(auVar77,auVar77,0xaa);
      auVar191._0_4_ = fVar128 * auVar77._0_4_;
      auVar191._4_4_ = fVar151 * auVar77._4_4_;
      auVar191._8_4_ = fVar138 * auVar77._8_4_;
      auVar191._12_4_ = fVar139 * auVar77._12_4_;
      auVar78 = vfmadd231ps_fma(auVar191,(undefined1  [16])aVar5,auVar78);
      auVar22 = vfmadd231ps_fma(auVar78,(undefined1  [16])aVar4,auVar144);
      auVar98 = *(undefined1 (*) [32])(bezier_basis0 + lVar27);
      uVar129 = auVar20._0_4_;
      local_500._4_4_ = uVar129;
      local_500._0_4_ = uVar129;
      local_500._8_4_ = uVar129;
      local_500._12_4_ = uVar129;
      local_500._16_4_ = uVar129;
      local_500._20_4_ = uVar129;
      local_500._24_4_ = uVar129;
      local_500._28_4_ = uVar129;
      auVar100 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0x484);
      auVar83._8_4_ = 1;
      auVar83._0_8_ = 0x100000001;
      auVar83._12_4_ = 1;
      auVar83._16_4_ = 1;
      auVar83._20_4_ = 1;
      auVar83._24_4_ = 1;
      auVar83._28_4_ = 1;
      local_520 = vpermps_avx2(auVar83,ZEXT1632(auVar20));
      uVar129 = auVar21._0_4_;
      local_680._4_4_ = uVar129;
      local_680._0_4_ = uVar129;
      local_680._8_4_ = uVar129;
      local_680._12_4_ = uVar129;
      local_680._16_4_ = uVar129;
      local_680._20_4_ = uVar129;
      local_680._24_4_ = uVar129;
      local_680._28_4_ = uVar129;
      local_6a0 = vpermps_avx512vl(auVar83,ZEXT1632(auVar21));
      auVar96 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0x908);
      local_5c0 = vbroadcastss_avx512vl(auVar79);
      auVar205 = ZEXT3264(local_5c0);
      local_5e0 = vpermps_avx512vl(auVar83,ZEXT1632(auVar79));
      auVar95 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0xd8c);
      local_600 = vbroadcastss_avx512vl(auVar22);
      auVar203 = ZEXT3264(local_600);
      local_620 = vpermps_avx512vl(auVar83,ZEXT1632(auVar22));
      auVar204 = ZEXT3264(local_620);
      auVar83 = vmulps_avx512vl(local_600,auVar95);
      auVar84 = vmulps_avx512vl(local_620,auVar95);
      auVar83 = vfmadd231ps_avx512vl(auVar83,auVar96,local_5c0);
      auVar84 = vfmadd231ps_avx512vl(auVar84,auVar96,local_5e0);
      auVar78 = vfmadd231ps_fma(auVar83,auVar100,local_680);
      auVar85 = vfmadd231ps_avx512vl(auVar84,auVar100,local_6a0);
      auVar86 = vfmadd231ps_avx512vl(ZEXT1632(auVar78),auVar98,local_500);
      auVar83 = *(undefined1 (*) [32])(bezier_basis1 + lVar27);
      auVar84 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0x484);
      auVar94 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0x908);
      auVar87 = vfmadd231ps_avx512vl(auVar85,auVar98,local_520);
      auVar85 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0xd8c);
      auVar88 = vmulps_avx512vl(local_600,auVar85);
      auVar89 = vmulps_avx512vl(local_620,auVar85);
      auVar88 = vfmadd231ps_avx512vl(auVar88,auVar94,local_5c0);
      auVar89 = vfmadd231ps_avx512vl(auVar89,auVar94,local_5e0);
      auVar88 = vfmadd231ps_avx512vl(auVar88,auVar84,local_680);
      auVar89 = vfmadd231ps_avx512vl(auVar89,auVar84,local_6a0);
      auVar23 = vfmadd231ps_fma(auVar88,auVar83,local_500);
      auVar24 = vfmadd231ps_fma(auVar89,auVar83,local_520);
      auVar89 = vsubps_avx512vl(ZEXT1632(auVar23),auVar86);
      auVar90 = vsubps_avx512vl(ZEXT1632(auVar24),auVar87);
      auVar88 = vmulps_avx512vl(auVar87,auVar89);
      auVar91 = vmulps_avx512vl(auVar86,auVar90);
      auVar88 = vsubps_avx512vl(auVar88,auVar91);
      auVar78 = vshufps_avx(local_630,local_630,0xff);
      uVar140 = auVar78._0_8_;
      local_80._8_8_ = uVar140;
      local_80._0_8_ = uVar140;
      local_80._16_8_ = uVar140;
      local_80._24_8_ = uVar140;
      auVar78 = vshufps_avx(local_640,local_640,0xff);
      local_a0 = vbroadcastsd_avx512vl(auVar78);
      auVar78 = vshufps_avx512vl(local_650,local_650,0xff);
      local_c0 = vbroadcastsd_avx512vl(auVar78);
      auVar78 = vshufps_avx512vl(_local_4b0,_local_4b0,0xff);
      uVar140 = auVar78._0_8_;
      register0x000012c8 = uVar140;
      local_e0 = uVar140;
      register0x000012d0 = uVar140;
      register0x000012d8 = uVar140;
      auVar91 = vmulps_avx512vl(_local_e0,auVar95);
      auVar91 = vfmadd231ps_avx512vl(auVar91,auVar96,local_c0);
      auVar91 = vfmadd231ps_avx512vl(auVar91,auVar100,local_a0);
      auVar91 = vfmadd231ps_avx512vl(auVar91,auVar98,local_80);
      auVar92 = vmulps_avx512vl(_local_e0,auVar85);
      auVar92 = vfmadd231ps_avx512vl(auVar92,auVar94,local_c0);
      auVar92 = vfmadd231ps_avx512vl(auVar92,auVar84,local_a0);
      auVar25 = vfmadd231ps_fma(auVar92,auVar83,local_80);
      auVar92 = vmulps_avx512vl(auVar90,auVar90);
      auVar92 = vfmadd231ps_avx512vl(auVar92,auVar89,auVar89);
      auVar93 = vmaxps_avx512vl(auVar91,ZEXT1632(auVar25));
      auVar93 = vmulps_avx512vl(auVar93,auVar93);
      auVar92 = vmulps_avx512vl(auVar93,auVar92);
      auVar88 = vmulps_avx512vl(auVar88,auVar88);
      uVar140 = vcmpps_avx512vl(auVar88,auVar92,2);
      auVar78 = vblendps_avx(auVar20,local_630,8);
      auVar80 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar77 = vandps_avx512vl(auVar78,auVar80);
      auVar78 = vblendps_avx(auVar21,local_640,8);
      auVar78 = vandps_avx512vl(auVar78,auVar80);
      auVar77 = vmaxps_avx(auVar77,auVar78);
      auVar78 = vblendps_avx(auVar79,local_650,8);
      auVar81 = vandps_avx512vl(auVar78,auVar80);
      auVar78 = vblendps_avx(auVar22,_local_4b0,8);
      auVar78 = vandps_avx512vl(auVar78,auVar80);
      auVar78 = vmaxps_avx(auVar81,auVar78);
      auVar78 = vmaxps_avx(auVar77,auVar78);
      auVar77 = vmovshdup_avx(auVar78);
      auVar77 = vmaxss_avx(auVar77,auVar78);
      auVar78 = vshufpd_avx(auVar78,auVar78,1);
      auVar78 = vmaxss_avx(auVar78,auVar77);
      auVar77 = vcvtsi2ss_avx512f(local_650,iVar8);
      local_460._0_16_ = auVar77;
      auVar92._0_4_ = auVar77._0_4_;
      auVar92._4_4_ = auVar92._0_4_;
      auVar92._8_4_ = auVar92._0_4_;
      auVar92._12_4_ = auVar92._0_4_;
      auVar92._16_4_ = auVar92._0_4_;
      auVar92._20_4_ = auVar92._0_4_;
      auVar92._24_4_ = auVar92._0_4_;
      auVar92._28_4_ = auVar92._0_4_;
      uVar26 = vcmpps_avx512vl(auVar92,_DAT_01faff40,0xe);
      bVar71 = (byte)uVar140 & (byte)uVar26;
      fVar128 = auVar78._0_4_ * 4.7683716e-07;
      auVar88._8_4_ = 2;
      auVar88._0_8_ = 0x200000002;
      auVar88._12_4_ = 2;
      auVar88._16_4_ = 2;
      auVar88._20_4_ = 2;
      auVar88._24_4_ = 2;
      auVar88._28_4_ = 2;
      local_100 = vpermps_avx512vl(auVar88,ZEXT1632(auVar20));
      local_120 = vpermps_avx512vl(auVar88,ZEXT1632(auVar21));
      local_140 = vpermps_avx512vl(auVar88,ZEXT1632(auVar79));
      auVar88 = vpermps_avx2(auVar88,ZEXT1632(auVar22));
      uVar68 = *(uint *)(ray + k * 4 + 0x60);
      auVar78 = local_100._0_16_;
      if (bVar71 == 0) {
        uVar65 = 0;
        auVar98 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar198 = ZEXT3264(auVar98);
        auVar78 = vxorps_avx512vl(auVar78,auVar78);
        auVar199 = ZEXT1664(auVar78);
        auVar200 = ZEXT3264(local_500);
        auVar201 = ZEXT3264(local_520);
        auVar197 = ZEXT3264(local_680);
        auVar196 = ZEXT3264(local_6a0);
        auVar202 = ZEXT3264(local_5e0);
      }
      else {
        local_560._0_16_ = ZEXT416(uVar68);
        auVar85 = vmulps_avx512vl(auVar88,auVar85);
        auVar94 = vfmadd213ps_avx512vl(auVar94,local_140,auVar85);
        auVar84 = vfmadd213ps_avx512vl(auVar84,local_120,auVar94);
        auVar93 = vfmadd213ps_avx512vl(auVar83,local_100,auVar84);
        auVar95 = vmulps_avx512vl(auVar88,auVar95);
        auVar96 = vfmadd213ps_avx512vl(auVar96,local_140,auVar95);
        auVar84 = vfmadd213ps_avx512vl(auVar100,local_120,auVar96);
        auVar100 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0x1210);
        auVar96 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0x1694);
        auVar95 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0x1b18);
        auVar83 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0x1f9c);
        auVar97 = vfmadd213ps_avx512vl(auVar98,local_100,auVar84);
        auVar98 = vmulps_avx512vl(local_600,auVar83);
        auVar84 = vmulps_avx512vl(local_620,auVar83);
        auVar188._0_4_ = auVar88._0_4_ * auVar83._0_4_;
        auVar188._4_4_ = auVar88._4_4_ * auVar83._4_4_;
        auVar188._8_4_ = auVar88._8_4_ * auVar83._8_4_;
        auVar188._12_4_ = auVar88._12_4_ * auVar83._12_4_;
        auVar188._16_4_ = auVar88._16_4_ * auVar83._16_4_;
        auVar188._20_4_ = auVar88._20_4_ * auVar83._20_4_;
        auVar188._24_4_ = auVar88._24_4_ * auVar83._24_4_;
        auVar188._28_4_ = 0;
        auVar98 = vfmadd231ps_avx512vl(auVar98,auVar95,local_5c0);
        auVar83 = vfmadd231ps_avx512vl(auVar84,auVar95,local_5e0);
        auVar95 = vfmadd231ps_avx512vl(auVar188,local_140,auVar95);
        auVar98 = vfmadd231ps_avx512vl(auVar98,auVar96,local_680);
        auVar83 = vfmadd231ps_avx512vl(auVar83,auVar96,local_6a0);
        auVar84 = vfmadd231ps_avx512vl(auVar95,local_120,auVar96);
        auVar94 = vfmadd231ps_avx512vl(auVar98,auVar100,local_500);
        auVar83 = vfmadd231ps_avx512vl(auVar83,auVar100,local_520);
        auVar98 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0x1210);
        auVar96 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0x1b18);
        auVar95 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0x1f9c);
        auVar84 = vfmadd231ps_avx512vl(auVar84,local_100,auVar100);
        auVar85 = vmulps_avx512vl(local_600,auVar95);
        auVar99 = vmulps_avx512vl(local_620,auVar95);
        auVar100._4_4_ = auVar88._4_4_ * auVar95._4_4_;
        auVar100._0_4_ = auVar88._0_4_ * auVar95._0_4_;
        auVar100._8_4_ = auVar88._8_4_ * auVar95._8_4_;
        auVar100._12_4_ = auVar88._12_4_ * auVar95._12_4_;
        auVar100._16_4_ = auVar88._16_4_ * auVar95._16_4_;
        auVar100._20_4_ = auVar88._20_4_ * auVar95._20_4_;
        auVar100._24_4_ = auVar88._24_4_ * auVar95._24_4_;
        auVar100._28_4_ = auVar95._28_4_;
        auVar95 = vfmadd231ps_avx512vl(auVar85,auVar96,local_5c0);
        auVar85 = vfmadd231ps_avx512vl(auVar99,auVar96,local_5e0);
        auVar96 = vfmadd231ps_avx512vl(auVar100,local_140,auVar96);
        auVar100 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0x1694);
        auVar95 = vfmadd231ps_avx512vl(auVar95,auVar100,local_680);
        auVar85 = vfmadd231ps_avx512vl(auVar85,auVar100,local_6a0);
        auVar100 = vfmadd231ps_avx512vl(auVar96,local_120,auVar100);
        auVar96 = vfmadd231ps_avx512vl(auVar95,auVar98,local_500);
        auVar95 = vfmadd231ps_avx512vl(auVar85,auVar98,local_520);
        auVar85 = vfmadd231ps_avx512vl(auVar100,local_100,auVar98);
        auVar192._8_4_ = 0x7fffffff;
        auVar192._0_8_ = 0x7fffffff7fffffff;
        auVar192._12_4_ = 0x7fffffff;
        auVar192._16_4_ = 0x7fffffff;
        auVar192._20_4_ = 0x7fffffff;
        auVar192._24_4_ = 0x7fffffff;
        auVar192._28_4_ = 0x7fffffff;
        auVar98 = vandps_avx(auVar94,auVar192);
        auVar100 = vandps_avx(auVar83,auVar192);
        auVar100 = vmaxps_avx(auVar98,auVar100);
        auVar98 = vandps_avx(auVar84,auVar192);
        auVar98 = vmaxps_avx(auVar100,auVar98);
        auVar84 = vbroadcastss_avx512vl(ZEXT416((uint)fVar128));
        uVar62 = vcmpps_avx512vl(auVar98,auVar84,1);
        bVar12 = (bool)((byte)uVar62 & 1);
        auVar99._0_4_ = (float)((uint)bVar12 * auVar89._0_4_ | (uint)!bVar12 * auVar94._0_4_);
        bVar12 = (bool)((byte)(uVar62 >> 1) & 1);
        auVar99._4_4_ = (float)((uint)bVar12 * auVar89._4_4_ | (uint)!bVar12 * auVar94._4_4_);
        bVar12 = (bool)((byte)(uVar62 >> 2) & 1);
        auVar99._8_4_ = (float)((uint)bVar12 * auVar89._8_4_ | (uint)!bVar12 * auVar94._8_4_);
        bVar12 = (bool)((byte)(uVar62 >> 3) & 1);
        auVar99._12_4_ = (float)((uint)bVar12 * auVar89._12_4_ | (uint)!bVar12 * auVar94._12_4_);
        bVar12 = (bool)((byte)(uVar62 >> 4) & 1);
        auVar99._16_4_ = (float)((uint)bVar12 * auVar89._16_4_ | (uint)!bVar12 * auVar94._16_4_);
        bVar12 = (bool)((byte)(uVar62 >> 5) & 1);
        auVar99._20_4_ = (float)((uint)bVar12 * auVar89._20_4_ | (uint)!bVar12 * auVar94._20_4_);
        bVar12 = (bool)((byte)(uVar62 >> 6) & 1);
        auVar99._24_4_ = (float)((uint)bVar12 * auVar89._24_4_ | (uint)!bVar12 * auVar94._24_4_);
        bVar12 = SUB81(uVar62 >> 7,0);
        auVar99._28_4_ = (uint)bVar12 * auVar89._28_4_ | (uint)!bVar12 * auVar94._28_4_;
        bVar12 = (bool)((byte)uVar62 & 1);
        auVar101._0_4_ = (float)((uint)bVar12 * auVar90._0_4_ | (uint)!bVar12 * auVar83._0_4_);
        bVar12 = (bool)((byte)(uVar62 >> 1) & 1);
        auVar101._4_4_ = (float)((uint)bVar12 * auVar90._4_4_ | (uint)!bVar12 * auVar83._4_4_);
        bVar12 = (bool)((byte)(uVar62 >> 2) & 1);
        auVar101._8_4_ = (float)((uint)bVar12 * auVar90._8_4_ | (uint)!bVar12 * auVar83._8_4_);
        bVar12 = (bool)((byte)(uVar62 >> 3) & 1);
        auVar101._12_4_ = (float)((uint)bVar12 * auVar90._12_4_ | (uint)!bVar12 * auVar83._12_4_);
        bVar12 = (bool)((byte)(uVar62 >> 4) & 1);
        auVar101._16_4_ = (float)((uint)bVar12 * auVar90._16_4_ | (uint)!bVar12 * auVar83._16_4_);
        bVar12 = (bool)((byte)(uVar62 >> 5) & 1);
        auVar101._20_4_ = (float)((uint)bVar12 * auVar90._20_4_ | (uint)!bVar12 * auVar83._20_4_);
        bVar12 = (bool)((byte)(uVar62 >> 6) & 1);
        auVar101._24_4_ = (float)((uint)bVar12 * auVar90._24_4_ | (uint)!bVar12 * auVar83._24_4_);
        bVar12 = SUB81(uVar62 >> 7,0);
        auVar101._28_4_ = (uint)bVar12 * auVar90._28_4_ | (uint)!bVar12 * auVar83._28_4_;
        auVar98 = vandps_avx(auVar192,auVar96);
        auVar100 = vandps_avx(auVar95,auVar192);
        auVar100 = vmaxps_avx(auVar98,auVar100);
        auVar98 = vandps_avx(auVar85,auVar192);
        auVar98 = vmaxps_avx(auVar100,auVar98);
        uVar62 = vcmpps_avx512vl(auVar98,auVar84,1);
        bVar12 = (bool)((byte)uVar62 & 1);
        auVar102._0_4_ = (float)((uint)bVar12 * auVar89._0_4_ | (uint)!bVar12 * auVar96._0_4_);
        bVar12 = (bool)((byte)(uVar62 >> 1) & 1);
        auVar102._4_4_ = (float)((uint)bVar12 * auVar89._4_4_ | (uint)!bVar12 * auVar96._4_4_);
        bVar12 = (bool)((byte)(uVar62 >> 2) & 1);
        auVar102._8_4_ = (float)((uint)bVar12 * auVar89._8_4_ | (uint)!bVar12 * auVar96._8_4_);
        bVar12 = (bool)((byte)(uVar62 >> 3) & 1);
        auVar102._12_4_ = (float)((uint)bVar12 * auVar89._12_4_ | (uint)!bVar12 * auVar96._12_4_);
        bVar12 = (bool)((byte)(uVar62 >> 4) & 1);
        auVar102._16_4_ = (float)((uint)bVar12 * auVar89._16_4_ | (uint)!bVar12 * auVar96._16_4_);
        bVar12 = (bool)((byte)(uVar62 >> 5) & 1);
        auVar102._20_4_ = (float)((uint)bVar12 * auVar89._20_4_ | (uint)!bVar12 * auVar96._20_4_);
        bVar12 = (bool)((byte)(uVar62 >> 6) & 1);
        auVar102._24_4_ = (float)((uint)bVar12 * auVar89._24_4_ | (uint)!bVar12 * auVar96._24_4_);
        bVar12 = SUB81(uVar62 >> 7,0);
        auVar102._28_4_ = (uint)bVar12 * auVar89._28_4_ | (uint)!bVar12 * auVar96._28_4_;
        bVar12 = (bool)((byte)uVar62 & 1);
        auVar103._0_4_ = (float)((uint)bVar12 * auVar90._0_4_ | (uint)!bVar12 * auVar95._0_4_);
        bVar12 = (bool)((byte)(uVar62 >> 1) & 1);
        auVar103._4_4_ = (float)((uint)bVar12 * auVar90._4_4_ | (uint)!bVar12 * auVar95._4_4_);
        bVar12 = (bool)((byte)(uVar62 >> 2) & 1);
        auVar103._8_4_ = (float)((uint)bVar12 * auVar90._8_4_ | (uint)!bVar12 * auVar95._8_4_);
        bVar12 = (bool)((byte)(uVar62 >> 3) & 1);
        auVar103._12_4_ = (float)((uint)bVar12 * auVar90._12_4_ | (uint)!bVar12 * auVar95._12_4_);
        bVar12 = (bool)((byte)(uVar62 >> 4) & 1);
        auVar103._16_4_ = (float)((uint)bVar12 * auVar90._16_4_ | (uint)!bVar12 * auVar95._16_4_);
        bVar12 = (bool)((byte)(uVar62 >> 5) & 1);
        auVar103._20_4_ = (float)((uint)bVar12 * auVar90._20_4_ | (uint)!bVar12 * auVar95._20_4_);
        bVar12 = (bool)((byte)(uVar62 >> 6) & 1);
        auVar103._24_4_ = (float)((uint)bVar12 * auVar90._24_4_ | (uint)!bVar12 * auVar95._24_4_);
        bVar12 = SUB81(uVar62 >> 7,0);
        auVar103._28_4_ = (uint)bVar12 * auVar90._28_4_ | (uint)!bVar12 * auVar95._28_4_;
        auVar82 = vxorps_avx512vl(auVar78,auVar78);
        auVar199 = ZEXT1664(auVar82);
        auVar98 = vfmadd213ps_avx512vl(auVar99,auVar99,ZEXT1632(auVar82));
        auVar78 = vfmadd231ps_fma(auVar98,auVar101,auVar101);
        auVar100 = vrsqrt14ps_avx512vl(ZEXT1632(auVar78));
        fVar151 = auVar100._0_4_;
        fVar138 = auVar100._4_4_;
        fVar139 = auVar100._8_4_;
        fVar174 = auVar100._12_4_;
        fVar173 = auVar100._16_4_;
        fVar177 = auVar100._20_4_;
        fVar72 = auVar100._24_4_;
        auVar98._4_4_ = fVar138 * fVar138 * fVar138 * auVar78._4_4_ * -0.5;
        auVar98._0_4_ = fVar151 * fVar151 * fVar151 * auVar78._0_4_ * -0.5;
        auVar98._8_4_ = fVar139 * fVar139 * fVar139 * auVar78._8_4_ * -0.5;
        auVar98._12_4_ = fVar174 * fVar174 * fVar174 * auVar78._12_4_ * -0.5;
        auVar98._16_4_ = fVar173 * fVar173 * fVar173 * -0.0;
        auVar98._20_4_ = fVar177 * fVar177 * fVar177 * -0.0;
        auVar98._24_4_ = fVar72 * fVar72 * fVar72 * -0.0;
        auVar98._28_4_ = auVar85._28_4_;
        auVar83 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar98 = vfmadd231ps_avx512vl(auVar98,auVar83,auVar100);
        auVar96._4_4_ = auVar101._4_4_ * auVar98._4_4_;
        auVar96._0_4_ = auVar101._0_4_ * auVar98._0_4_;
        auVar96._8_4_ = auVar101._8_4_ * auVar98._8_4_;
        auVar96._12_4_ = auVar101._12_4_ * auVar98._12_4_;
        auVar96._16_4_ = auVar101._16_4_ * auVar98._16_4_;
        auVar96._20_4_ = auVar101._20_4_ * auVar98._20_4_;
        auVar96._24_4_ = auVar101._24_4_ * auVar98._24_4_;
        auVar96._28_4_ = 0;
        auVar95._4_4_ = auVar98._4_4_ * -auVar99._4_4_;
        auVar95._0_4_ = auVar98._0_4_ * -auVar99._0_4_;
        auVar95._8_4_ = auVar98._8_4_ * -auVar99._8_4_;
        auVar95._12_4_ = auVar98._12_4_ * -auVar99._12_4_;
        auVar95._16_4_ = auVar98._16_4_ * -auVar99._16_4_;
        auVar95._20_4_ = auVar98._20_4_ * -auVar99._20_4_;
        auVar95._24_4_ = auVar98._24_4_ * -auVar99._24_4_;
        auVar95._28_4_ = auVar101._28_4_;
        auVar98 = vmulps_avx512vl(auVar98,ZEXT1632(auVar82));
        auVar89 = ZEXT1632(auVar82);
        auVar100 = vfmadd213ps_avx512vl(auVar102,auVar102,auVar89);
        auVar78 = vfmadd231ps_fma(auVar100,auVar103,auVar103);
        auVar100 = vrsqrt14ps_avx512vl(ZEXT1632(auVar78));
        fVar151 = auVar100._0_4_;
        fVar138 = auVar100._4_4_;
        fVar139 = auVar100._8_4_;
        fVar174 = auVar100._12_4_;
        fVar173 = auVar100._16_4_;
        fVar177 = auVar100._20_4_;
        fVar72 = auVar100._24_4_;
        auVar84._4_4_ = fVar138 * fVar138 * fVar138 * auVar78._4_4_ * -0.5;
        auVar84._0_4_ = fVar151 * fVar151 * fVar151 * auVar78._0_4_ * -0.5;
        auVar84._8_4_ = fVar139 * fVar139 * fVar139 * auVar78._8_4_ * -0.5;
        auVar84._12_4_ = fVar174 * fVar174 * fVar174 * auVar78._12_4_ * -0.5;
        auVar84._16_4_ = fVar173 * fVar173 * fVar173 * -0.0;
        auVar84._20_4_ = fVar177 * fVar177 * fVar177 * -0.0;
        auVar84._24_4_ = fVar72 * fVar72 * fVar72 * -0.0;
        auVar84._28_4_ = 0;
        auVar83 = vfmadd231ps_avx512vl(auVar84,auVar83,auVar100);
        auVar94._4_4_ = auVar103._4_4_ * auVar83._4_4_;
        auVar94._0_4_ = auVar103._0_4_ * auVar83._0_4_;
        auVar94._8_4_ = auVar103._8_4_ * auVar83._8_4_;
        auVar94._12_4_ = auVar103._12_4_ * auVar83._12_4_;
        auVar94._16_4_ = auVar103._16_4_ * auVar83._16_4_;
        auVar94._20_4_ = auVar103._20_4_ * auVar83._20_4_;
        auVar94._24_4_ = auVar103._24_4_ * auVar83._24_4_;
        auVar94._28_4_ = auVar100._28_4_;
        auVar85._4_4_ = -auVar102._4_4_ * auVar83._4_4_;
        auVar85._0_4_ = -auVar102._0_4_ * auVar83._0_4_;
        auVar85._8_4_ = -auVar102._8_4_ * auVar83._8_4_;
        auVar85._12_4_ = -auVar102._12_4_ * auVar83._12_4_;
        auVar85._16_4_ = -auVar102._16_4_ * auVar83._16_4_;
        auVar85._20_4_ = -auVar102._20_4_ * auVar83._20_4_;
        auVar85._24_4_ = -auVar102._24_4_ * auVar83._24_4_;
        auVar85._28_4_ = auVar102._28_4_ ^ 0x80000000;
        auVar100 = vmulps_avx512vl(auVar83,auVar89);
        auVar78 = vfmadd213ps_fma(auVar96,auVar91,auVar86);
        auVar77 = vfmadd213ps_fma(auVar95,auVar91,auVar87);
        auVar83 = vfmadd213ps_avx512vl(auVar98,auVar91,auVar97);
        auVar84 = vfmadd213ps_avx512vl(auVar94,ZEXT1632(auVar25),ZEXT1632(auVar23));
        auVar80 = vfnmadd213ps_fma(auVar96,auVar91,auVar86);
        auVar86 = ZEXT1632(auVar25);
        auVar79 = vfmadd213ps_fma(auVar85,auVar86,ZEXT1632(auVar24));
        auVar81 = vfnmadd213ps_fma(auVar95,auVar91,auVar87);
        auVar20 = vfmadd213ps_fma(auVar100,auVar86,auVar93);
        auVar96 = vfnmadd231ps_avx512vl(auVar97,auVar91,auVar98);
        auVar23 = vfnmadd213ps_fma(auVar94,auVar86,ZEXT1632(auVar23));
        auVar24 = vfnmadd213ps_fma(auVar85,auVar86,ZEXT1632(auVar24));
        auVar29 = vfnmadd231ps_fma(auVar93,ZEXT1632(auVar25),auVar100);
        auVar100 = vsubps_avx512vl(auVar84,ZEXT1632(auVar80));
        auVar98 = vsubps_avx(ZEXT1632(auVar79),ZEXT1632(auVar81));
        auVar95 = vsubps_avx512vl(ZEXT1632(auVar20),auVar96);
        auVar94 = vmulps_avx512vl(auVar98,auVar96);
        auVar21 = vfmsub231ps_fma(auVar94,ZEXT1632(auVar81),auVar95);
        auVar86._4_4_ = auVar80._4_4_ * auVar95._4_4_;
        auVar86._0_4_ = auVar80._0_4_ * auVar95._0_4_;
        auVar86._8_4_ = auVar80._8_4_ * auVar95._8_4_;
        auVar86._12_4_ = auVar80._12_4_ * auVar95._12_4_;
        auVar86._16_4_ = auVar95._16_4_ * 0.0;
        auVar86._20_4_ = auVar95._20_4_ * 0.0;
        auVar86._24_4_ = auVar95._24_4_ * 0.0;
        auVar86._28_4_ = auVar95._28_4_;
        auVar95 = vfmsub231ps_avx512vl(auVar86,auVar96,auVar100);
        auVar87._4_4_ = auVar81._4_4_ * auVar100._4_4_;
        auVar87._0_4_ = auVar81._0_4_ * auVar100._0_4_;
        auVar87._8_4_ = auVar81._8_4_ * auVar100._8_4_;
        auVar87._12_4_ = auVar81._12_4_ * auVar100._12_4_;
        auVar87._16_4_ = auVar100._16_4_ * 0.0;
        auVar87._20_4_ = auVar100._20_4_ * 0.0;
        auVar87._24_4_ = auVar100._24_4_ * 0.0;
        auVar87._28_4_ = auVar100._28_4_;
        auVar22 = vfmsub231ps_fma(auVar87,ZEXT1632(auVar80),auVar98);
        auVar98 = vfmadd231ps_avx512vl(ZEXT1632(auVar22),auVar89,auVar95);
        auVar98 = vfmadd231ps_avx512vl(auVar98,auVar89,ZEXT1632(auVar21));
        auVar99 = ZEXT1632(auVar82);
        uVar62 = vcmpps_avx512vl(auVar98,auVar99,2);
        bVar61 = (byte)uVar62;
        fVar72 = (float)((uint)(bVar61 & 1) * auVar78._0_4_ |
                        (uint)!(bool)(bVar61 & 1) * auVar23._0_4_);
        bVar12 = (bool)((byte)(uVar62 >> 1) & 1);
        fVar120 = (float)((uint)bVar12 * auVar78._4_4_ | (uint)!bVar12 * auVar23._4_4_);
        bVar12 = (bool)((byte)(uVar62 >> 2) & 1);
        fVar122 = (float)((uint)bVar12 * auVar78._8_4_ | (uint)!bVar12 * auVar23._8_4_);
        bVar12 = (bool)((byte)(uVar62 >> 3) & 1);
        fVar124 = (float)((uint)bVar12 * auVar78._12_4_ | (uint)!bVar12 * auVar23._12_4_);
        auVar94 = ZEXT1632(CONCAT412(fVar124,CONCAT48(fVar122,CONCAT44(fVar120,fVar72))));
        fVar73 = (float)((uint)(bVar61 & 1) * auVar77._0_4_ |
                        (uint)!(bool)(bVar61 & 1) * auVar24._0_4_);
        bVar12 = (bool)((byte)(uVar62 >> 1) & 1);
        fVar121 = (float)((uint)bVar12 * auVar77._4_4_ | (uint)!bVar12 * auVar24._4_4_);
        bVar12 = (bool)((byte)(uVar62 >> 2) & 1);
        fVar123 = (float)((uint)bVar12 * auVar77._8_4_ | (uint)!bVar12 * auVar24._8_4_);
        bVar12 = (bool)((byte)(uVar62 >> 3) & 1);
        fVar125 = (float)((uint)bVar12 * auVar77._12_4_ | (uint)!bVar12 * auVar24._12_4_);
        auVar85 = ZEXT1632(CONCAT412(fVar125,CONCAT48(fVar123,CONCAT44(fVar121,fVar73))));
        auVar97._0_4_ =
             (float)((uint)(bVar61 & 1) * auVar83._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar29._0_4_)
        ;
        bVar12 = (bool)((byte)(uVar62 >> 1) & 1);
        auVar97._4_4_ = (float)((uint)bVar12 * auVar83._4_4_ | (uint)!bVar12 * auVar29._4_4_);
        bVar12 = (bool)((byte)(uVar62 >> 2) & 1);
        auVar97._8_4_ = (float)((uint)bVar12 * auVar83._8_4_ | (uint)!bVar12 * auVar29._8_4_);
        bVar12 = (bool)((byte)(uVar62 >> 3) & 1);
        auVar97._12_4_ = (float)((uint)bVar12 * auVar83._12_4_ | (uint)!bVar12 * auVar29._12_4_);
        fVar151 = (float)((uint)((byte)(uVar62 >> 4) & 1) * auVar83._16_4_);
        auVar97._16_4_ = fVar151;
        fVar138 = (float)((uint)((byte)(uVar62 >> 5) & 1) * auVar83._20_4_);
        auVar97._20_4_ = fVar138;
        fVar139 = (float)((uint)((byte)(uVar62 >> 6) & 1) * auVar83._24_4_);
        auVar97._24_4_ = fVar139;
        iVar1 = (uint)(byte)(uVar62 >> 7) * auVar83._28_4_;
        auVar97._28_4_ = iVar1;
        auVar100 = vblendmps_avx512vl(ZEXT1632(auVar80),auVar84);
        auVar104._0_4_ =
             (uint)(bVar61 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar21._0_4_;
        bVar12 = (bool)((byte)(uVar62 >> 1) & 1);
        auVar104._4_4_ = (uint)bVar12 * auVar100._4_4_ | (uint)!bVar12 * auVar21._4_4_;
        bVar12 = (bool)((byte)(uVar62 >> 2) & 1);
        auVar104._8_4_ = (uint)bVar12 * auVar100._8_4_ | (uint)!bVar12 * auVar21._8_4_;
        bVar12 = (bool)((byte)(uVar62 >> 3) & 1);
        auVar104._12_4_ = (uint)bVar12 * auVar100._12_4_ | (uint)!bVar12 * auVar21._12_4_;
        auVar104._16_4_ = (uint)((byte)(uVar62 >> 4) & 1) * auVar100._16_4_;
        auVar104._20_4_ = (uint)((byte)(uVar62 >> 5) & 1) * auVar100._20_4_;
        auVar104._24_4_ = (uint)((byte)(uVar62 >> 6) & 1) * auVar100._24_4_;
        auVar104._28_4_ = (uint)(byte)(uVar62 >> 7) * auVar100._28_4_;
        auVar100 = vblendmps_avx512vl(ZEXT1632(auVar81),ZEXT1632(auVar79));
        auVar105._0_4_ =
             (float)((uint)(bVar61 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar77._0_4_
                    );
        bVar12 = (bool)((byte)(uVar62 >> 1) & 1);
        auVar105._4_4_ = (float)((uint)bVar12 * auVar100._4_4_ | (uint)!bVar12 * auVar77._4_4_);
        bVar12 = (bool)((byte)(uVar62 >> 2) & 1);
        auVar105._8_4_ = (float)((uint)bVar12 * auVar100._8_4_ | (uint)!bVar12 * auVar77._8_4_);
        bVar12 = (bool)((byte)(uVar62 >> 3) & 1);
        auVar105._12_4_ = (float)((uint)bVar12 * auVar100._12_4_ | (uint)!bVar12 * auVar77._12_4_);
        fVar174 = (float)((uint)((byte)(uVar62 >> 4) & 1) * auVar100._16_4_);
        auVar105._16_4_ = fVar174;
        fVar173 = (float)((uint)((byte)(uVar62 >> 5) & 1) * auVar100._20_4_);
        auVar105._20_4_ = fVar173;
        fVar177 = (float)((uint)((byte)(uVar62 >> 6) & 1) * auVar100._24_4_);
        auVar105._24_4_ = fVar177;
        auVar105._28_4_ = (uint)(byte)(uVar62 >> 7) * auVar100._28_4_;
        auVar100 = vblendmps_avx512vl(auVar96,ZEXT1632(auVar20));
        auVar106._0_4_ =
             (float)((uint)(bVar61 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar83._0_4_
                    );
        bVar12 = (bool)((byte)(uVar62 >> 1) & 1);
        auVar106._4_4_ = (float)((uint)bVar12 * auVar100._4_4_ | (uint)!bVar12 * auVar83._4_4_);
        bVar12 = (bool)((byte)(uVar62 >> 2) & 1);
        auVar106._8_4_ = (float)((uint)bVar12 * auVar100._8_4_ | (uint)!bVar12 * auVar83._8_4_);
        bVar12 = (bool)((byte)(uVar62 >> 3) & 1);
        auVar106._12_4_ = (float)((uint)bVar12 * auVar100._12_4_ | (uint)!bVar12 * auVar83._12_4_);
        bVar12 = (bool)((byte)(uVar62 >> 4) & 1);
        auVar106._16_4_ = (float)((uint)bVar12 * auVar100._16_4_ | (uint)!bVar12 * auVar83._16_4_);
        bVar12 = (bool)((byte)(uVar62 >> 5) & 1);
        auVar106._20_4_ = (float)((uint)bVar12 * auVar100._20_4_ | (uint)!bVar12 * auVar83._20_4_);
        bVar12 = (bool)((byte)(uVar62 >> 6) & 1);
        auVar106._24_4_ = (float)((uint)bVar12 * auVar100._24_4_ | (uint)!bVar12 * auVar83._24_4_);
        bVar12 = SUB81(uVar62 >> 7,0);
        auVar106._28_4_ = (uint)bVar12 * auVar100._28_4_ | (uint)!bVar12 * auVar83._28_4_;
        auVar107._0_4_ =
             (uint)(bVar61 & 1) * (int)auVar80._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar84._0_4_;
        bVar12 = (bool)((byte)(uVar62 >> 1) & 1);
        auVar107._4_4_ = (uint)bVar12 * (int)auVar80._4_4_ | (uint)!bVar12 * auVar84._4_4_;
        bVar12 = (bool)((byte)(uVar62 >> 2) & 1);
        auVar107._8_4_ = (uint)bVar12 * (int)auVar80._8_4_ | (uint)!bVar12 * auVar84._8_4_;
        bVar12 = (bool)((byte)(uVar62 >> 3) & 1);
        auVar107._12_4_ = (uint)bVar12 * (int)auVar80._12_4_ | (uint)!bVar12 * auVar84._12_4_;
        auVar107._16_4_ = (uint)!(bool)((byte)(uVar62 >> 4) & 1) * auVar84._16_4_;
        auVar107._20_4_ = (uint)!(bool)((byte)(uVar62 >> 5) & 1) * auVar84._20_4_;
        auVar107._24_4_ = (uint)!(bool)((byte)(uVar62 >> 6) & 1) * auVar84._24_4_;
        auVar107._28_4_ = (uint)!SUB81(uVar62 >> 7,0) * auVar84._28_4_;
        bVar12 = (bool)((byte)(uVar62 >> 1) & 1);
        bVar14 = (bool)((byte)(uVar62 >> 2) & 1);
        bVar15 = (bool)((byte)(uVar62 >> 3) & 1);
        auVar108._0_4_ =
             (uint)(bVar61 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar20._0_4_;
        bVar13 = (bool)((byte)(uVar62 >> 1) & 1);
        auVar108._4_4_ = (uint)bVar13 * auVar96._4_4_ | (uint)!bVar13 * auVar20._4_4_;
        bVar13 = (bool)((byte)(uVar62 >> 2) & 1);
        auVar108._8_4_ = (uint)bVar13 * auVar96._8_4_ | (uint)!bVar13 * auVar20._8_4_;
        bVar13 = (bool)((byte)(uVar62 >> 3) & 1);
        auVar108._12_4_ = (uint)bVar13 * auVar96._12_4_ | (uint)!bVar13 * auVar20._12_4_;
        auVar108._16_4_ = (uint)((byte)(uVar62 >> 4) & 1) * auVar96._16_4_;
        auVar108._20_4_ = (uint)((byte)(uVar62 >> 5) & 1) * auVar96._20_4_;
        auVar108._24_4_ = (uint)((byte)(uVar62 >> 6) & 1) * auVar96._24_4_;
        iVar2 = (uint)(byte)(uVar62 >> 7) * auVar96._28_4_;
        auVar108._28_4_ = iVar2;
        auVar86 = vsubps_avx512vl(auVar107,auVar94);
        auVar100 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar15 * (int)auVar81._12_4_ |
                                                 (uint)!bVar15 * auVar79._12_4_,
                                                 CONCAT48((uint)bVar14 * (int)auVar81._8_4_ |
                                                          (uint)!bVar14 * auVar79._8_4_,
                                                          CONCAT44((uint)bVar12 * (int)auVar81._4_4_
                                                                   | (uint)!bVar12 * auVar79._4_4_,
                                                                   (uint)(bVar61 & 1) *
                                                                   (int)auVar81._0_4_ |
                                                                   (uint)!(bool)(bVar61 & 1) *
                                                                   auVar79._0_4_)))),auVar85);
        auVar96 = vsubps_avx(auVar108,auVar97);
        auVar95 = vsubps_avx(auVar94,auVar104);
        auVar83 = vsubps_avx(auVar85,auVar105);
        auVar84 = vsubps_avx(auVar97,auVar106);
        auVar89._4_4_ = auVar96._4_4_ * fVar120;
        auVar89._0_4_ = auVar96._0_4_ * fVar72;
        auVar89._8_4_ = auVar96._8_4_ * fVar122;
        auVar89._12_4_ = auVar96._12_4_ * fVar124;
        auVar89._16_4_ = auVar96._16_4_ * 0.0;
        auVar89._20_4_ = auVar96._20_4_ * 0.0;
        auVar89._24_4_ = auVar96._24_4_ * 0.0;
        auVar89._28_4_ = iVar2;
        auVar78 = vfmsub231ps_fma(auVar89,auVar97,auVar86);
        auVar90._4_4_ = fVar121 * auVar86._4_4_;
        auVar90._0_4_ = fVar73 * auVar86._0_4_;
        auVar90._8_4_ = fVar123 * auVar86._8_4_;
        auVar90._12_4_ = fVar125 * auVar86._12_4_;
        auVar90._16_4_ = auVar86._16_4_ * 0.0;
        auVar90._20_4_ = auVar86._20_4_ * 0.0;
        auVar90._24_4_ = auVar86._24_4_ * 0.0;
        auVar90._28_4_ = auVar98._28_4_;
        auVar77 = vfmsub231ps_fma(auVar90,auVar94,auVar100);
        auVar98 = vfmadd231ps_avx512vl(ZEXT1632(auVar77),auVar99,ZEXT1632(auVar78));
        auVar160._0_4_ = auVar100._0_4_ * auVar97._0_4_;
        auVar160._4_4_ = auVar100._4_4_ * auVar97._4_4_;
        auVar160._8_4_ = auVar100._8_4_ * auVar97._8_4_;
        auVar160._12_4_ = auVar100._12_4_ * auVar97._12_4_;
        auVar160._16_4_ = auVar100._16_4_ * fVar151;
        auVar160._20_4_ = auVar100._20_4_ * fVar138;
        auVar160._24_4_ = auVar100._24_4_ * fVar139;
        auVar160._28_4_ = 0;
        auVar78 = vfmsub231ps_fma(auVar160,auVar85,auVar96);
        auVar87 = vfmadd231ps_avx512vl(auVar98,auVar99,ZEXT1632(auVar78));
        auVar98 = vmulps_avx512vl(auVar84,auVar104);
        auVar98 = vfmsub231ps_avx512vl(auVar98,auVar95,auVar106);
        auVar93._4_4_ = auVar83._4_4_ * auVar106._4_4_;
        auVar93._0_4_ = auVar83._0_4_ * auVar106._0_4_;
        auVar93._8_4_ = auVar83._8_4_ * auVar106._8_4_;
        auVar93._12_4_ = auVar83._12_4_ * auVar106._12_4_;
        auVar93._16_4_ = auVar83._16_4_ * auVar106._16_4_;
        auVar93._20_4_ = auVar83._20_4_ * auVar106._20_4_;
        auVar93._24_4_ = auVar83._24_4_ * auVar106._24_4_;
        auVar93._28_4_ = auVar106._28_4_;
        auVar78 = vfmsub231ps_fma(auVar93,auVar105,auVar84);
        auVar161._0_4_ = auVar105._0_4_ * auVar95._0_4_;
        auVar161._4_4_ = auVar105._4_4_ * auVar95._4_4_;
        auVar161._8_4_ = auVar105._8_4_ * auVar95._8_4_;
        auVar161._12_4_ = auVar105._12_4_ * auVar95._12_4_;
        auVar161._16_4_ = fVar174 * auVar95._16_4_;
        auVar161._20_4_ = fVar173 * auVar95._20_4_;
        auVar161._24_4_ = fVar177 * auVar95._24_4_;
        auVar161._28_4_ = 0;
        auVar77 = vfmsub231ps_fma(auVar161,auVar83,auVar104);
        auVar98 = vfmadd231ps_avx512vl(ZEXT1632(auVar77),auVar99,auVar98);
        auVar89 = vfmadd231ps_avx512vl(auVar98,auVar99,ZEXT1632(auVar78));
        auVar98 = vmaxps_avx(auVar87,auVar89);
        uVar140 = vcmpps_avx512vl(auVar98,auVar99,2);
        bVar71 = bVar71 & (byte)uVar140;
        auVar200 = ZEXT3264(local_500);
        auVar201 = ZEXT3264(local_520);
        auVar197 = ZEXT3264(local_680);
        auVar196 = ZEXT3264(local_6a0);
        if (bVar71 == 0) {
          uVar65 = 0;
          auVar98 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar198 = ZEXT3264(auVar98);
          auVar205 = ZEXT3264(local_5c0);
          auVar202 = ZEXT3264(local_5e0);
          auVar203 = ZEXT3264(local_600);
          auVar204 = ZEXT3264(local_620);
        }
        else {
          auVar90 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x100)));
          auVar195 = ZEXT3264(auVar90);
          auVar36._4_4_ = auVar84._4_4_ * auVar100._4_4_;
          auVar36._0_4_ = auVar84._0_4_ * auVar100._0_4_;
          auVar36._8_4_ = auVar84._8_4_ * auVar100._8_4_;
          auVar36._12_4_ = auVar84._12_4_ * auVar100._12_4_;
          auVar36._16_4_ = auVar84._16_4_ * auVar100._16_4_;
          auVar36._20_4_ = auVar84._20_4_ * auVar100._20_4_;
          auVar36._24_4_ = auVar84._24_4_ * auVar100._24_4_;
          auVar36._28_4_ = auVar98._28_4_;
          auVar79 = vfmsub231ps_fma(auVar36,auVar83,auVar96);
          auVar37._4_4_ = auVar96._4_4_ * auVar95._4_4_;
          auVar37._0_4_ = auVar96._0_4_ * auVar95._0_4_;
          auVar37._8_4_ = auVar96._8_4_ * auVar95._8_4_;
          auVar37._12_4_ = auVar96._12_4_ * auVar95._12_4_;
          auVar37._16_4_ = auVar96._16_4_ * auVar95._16_4_;
          auVar37._20_4_ = auVar96._20_4_ * auVar95._20_4_;
          auVar37._24_4_ = auVar96._24_4_ * auVar95._24_4_;
          auVar37._28_4_ = auVar96._28_4_;
          auVar77 = vfmsub231ps_fma(auVar37,auVar86,auVar84);
          auVar38._4_4_ = auVar83._4_4_ * auVar86._4_4_;
          auVar38._0_4_ = auVar83._0_4_ * auVar86._0_4_;
          auVar38._8_4_ = auVar83._8_4_ * auVar86._8_4_;
          auVar38._12_4_ = auVar83._12_4_ * auVar86._12_4_;
          auVar38._16_4_ = auVar83._16_4_ * auVar86._16_4_;
          auVar38._20_4_ = auVar83._20_4_ * auVar86._20_4_;
          auVar38._24_4_ = auVar83._24_4_ * auVar86._24_4_;
          auVar38._28_4_ = auVar83._28_4_;
          auVar20 = vfmsub231ps_fma(auVar38,auVar95,auVar100);
          auVar78 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar77),ZEXT1632(auVar20));
          auVar98 = vfmadd231ps_avx512vl(ZEXT1632(auVar78),ZEXT1632(auVar79),auVar99);
          auVar100 = vrcp14ps_avx512vl(auVar98);
          auVar96 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar198 = ZEXT3264(auVar96);
          auVar95 = vfnmadd213ps_avx512vl(auVar100,auVar98,auVar96);
          auVar78 = vfmadd132ps_fma(auVar95,auVar100,auVar100);
          auVar39._4_4_ = auVar20._4_4_ * auVar97._4_4_;
          auVar39._0_4_ = auVar20._0_4_ * auVar97._0_4_;
          auVar39._8_4_ = auVar20._8_4_ * auVar97._8_4_;
          auVar39._12_4_ = auVar20._12_4_ * auVar97._12_4_;
          auVar39._16_4_ = fVar151 * 0.0;
          auVar39._20_4_ = fVar138 * 0.0;
          auVar39._24_4_ = fVar139 * 0.0;
          auVar39._28_4_ = iVar1;
          auVar77 = vfmadd231ps_fma(auVar39,auVar85,ZEXT1632(auVar77));
          auVar77 = vfmadd231ps_fma(ZEXT1632(auVar77),auVar94,ZEXT1632(auVar79));
          fVar151 = auVar78._0_4_;
          fVar138 = auVar78._4_4_;
          fVar139 = auVar78._8_4_;
          fVar174 = auVar78._12_4_;
          local_380 = ZEXT1632(CONCAT412(auVar77._12_4_ * fVar174,
                                         CONCAT48(auVar77._8_4_ * fVar139,
                                                  CONCAT44(auVar77._4_4_ * fVar138,
                                                           auVar77._0_4_ * fVar151))));
          auVar180._4_4_ = uVar68;
          auVar180._0_4_ = uVar68;
          auVar180._8_4_ = uVar68;
          auVar180._12_4_ = uVar68;
          auVar180._16_4_ = uVar68;
          auVar180._20_4_ = uVar68;
          auVar180._24_4_ = uVar68;
          auVar180._28_4_ = uVar68;
          uVar140 = vcmpps_avx512vl(local_380,auVar90,2);
          uVar26 = vcmpps_avx512vl(auVar180,local_380,2);
          bVar71 = (byte)uVar140 & (byte)uVar26 & bVar71;
          auVar205 = ZEXT3264(local_5c0);
          auVar202 = ZEXT3264(local_5e0);
          auVar203 = ZEXT3264(local_600);
          auVar204 = ZEXT3264(local_620);
          auVar194 = ZEXT3264(auVar88);
          if (bVar71 != 0) {
            uVar140 = vcmpps_avx512vl(auVar98,auVar99,4);
            bVar71 = bVar71 & (byte)uVar140;
            if (bVar71 != 0) {
              fVar173 = auVar87._0_4_ * fVar151;
              fVar177 = auVar87._4_4_ * fVar138;
              auVar40._4_4_ = fVar177;
              auVar40._0_4_ = fVar173;
              fVar72 = auVar87._8_4_ * fVar139;
              auVar40._8_4_ = fVar72;
              fVar73 = auVar87._12_4_ * fVar174;
              auVar40._12_4_ = fVar73;
              fVar120 = auVar87._16_4_ * 0.0;
              auVar40._16_4_ = fVar120;
              fVar121 = auVar87._20_4_ * 0.0;
              auVar40._20_4_ = fVar121;
              fVar122 = auVar87._24_4_ * 0.0;
              auVar40._24_4_ = fVar122;
              auVar40._28_4_ = auVar98._28_4_;
              auVar100 = vsubps_avx512vl(auVar96,auVar40);
              local_3c0._0_4_ =
                   (float)((uint)(bVar61 & 1) * (int)fVar173 |
                          (uint)!(bool)(bVar61 & 1) * auVar100._0_4_);
              bVar12 = (bool)((byte)(uVar62 >> 1) & 1);
              local_3c0._4_4_ =
                   (float)((uint)bVar12 * (int)fVar177 | (uint)!bVar12 * auVar100._4_4_);
              bVar12 = (bool)((byte)(uVar62 >> 2) & 1);
              local_3c0._8_4_ = (float)((uint)bVar12 * (int)fVar72 | (uint)!bVar12 * auVar100._8_4_)
              ;
              bVar12 = (bool)((byte)(uVar62 >> 3) & 1);
              local_3c0._12_4_ =
                   (float)((uint)bVar12 * (int)fVar73 | (uint)!bVar12 * auVar100._12_4_);
              bVar12 = (bool)((byte)(uVar62 >> 4) & 1);
              local_3c0._16_4_ =
                   (float)((uint)bVar12 * (int)fVar120 | (uint)!bVar12 * auVar100._16_4_);
              bVar12 = (bool)((byte)(uVar62 >> 5) & 1);
              local_3c0._20_4_ =
                   (float)((uint)bVar12 * (int)fVar121 | (uint)!bVar12 * auVar100._20_4_);
              bVar12 = (bool)((byte)(uVar62 >> 6) & 1);
              local_3c0._24_4_ =
                   (float)((uint)bVar12 * (int)fVar122 | (uint)!bVar12 * auVar100._24_4_);
              bVar12 = SUB81(uVar62 >> 7,0);
              local_3c0._28_4_ =
                   (float)((uint)bVar12 * auVar98._28_4_ | (uint)!bVar12 * auVar100._28_4_);
              auVar98 = vsubps_avx(ZEXT1632(auVar25),auVar91);
              auVar78 = vfmadd213ps_fma(auVar98,local_3c0,auVar91);
              uVar129 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
              auVar91._4_4_ = uVar129;
              auVar91._0_4_ = uVar129;
              auVar91._8_4_ = uVar129;
              auVar91._12_4_ = uVar129;
              auVar91._16_4_ = uVar129;
              auVar91._20_4_ = uVar129;
              auVar91._24_4_ = uVar129;
              auVar91._28_4_ = uVar129;
              auVar98 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar78._12_4_ + auVar78._12_4_,
                                                           CONCAT48(auVar78._8_4_ + auVar78._8_4_,
                                                                    CONCAT44(auVar78._4_4_ +
                                                                             auVar78._4_4_,
                                                                             auVar78._0_4_ +
                                                                             auVar78._0_4_)))),
                                        auVar91);
              uVar140 = vcmpps_avx512vl(local_380,auVar98,6);
              if (((byte)uVar140 & bVar71) != 0) {
                auVar156._0_4_ = auVar89._0_4_ * fVar151;
                auVar156._4_4_ = auVar89._4_4_ * fVar138;
                auVar156._8_4_ = auVar89._8_4_ * fVar139;
                auVar156._12_4_ = auVar89._12_4_ * fVar174;
                auVar156._16_4_ = auVar89._16_4_ * 0.0;
                auVar156._20_4_ = auVar89._20_4_ * 0.0;
                auVar156._24_4_ = auVar89._24_4_ * 0.0;
                auVar156._28_4_ = 0;
                auVar98 = vsubps_avx512vl(auVar96,auVar156);
                auVar109._0_4_ =
                     (uint)(bVar61 & 1) * (int)auVar156._0_4_ |
                     (uint)!(bool)(bVar61 & 1) * auVar98._0_4_;
                bVar12 = (bool)((byte)(uVar62 >> 1) & 1);
                auVar109._4_4_ = (uint)bVar12 * (int)auVar156._4_4_ | (uint)!bVar12 * auVar98._4_4_;
                bVar12 = (bool)((byte)(uVar62 >> 2) & 1);
                auVar109._8_4_ = (uint)bVar12 * (int)auVar156._8_4_ | (uint)!bVar12 * auVar98._8_4_;
                bVar12 = (bool)((byte)(uVar62 >> 3) & 1);
                auVar109._12_4_ =
                     (uint)bVar12 * (int)auVar156._12_4_ | (uint)!bVar12 * auVar98._12_4_;
                bVar12 = (bool)((byte)(uVar62 >> 4) & 1);
                auVar109._16_4_ =
                     (uint)bVar12 * (int)auVar156._16_4_ | (uint)!bVar12 * auVar98._16_4_;
                bVar12 = (bool)((byte)(uVar62 >> 5) & 1);
                auVar109._20_4_ =
                     (uint)bVar12 * (int)auVar156._20_4_ | (uint)!bVar12 * auVar98._20_4_;
                bVar12 = (bool)((byte)(uVar62 >> 6) & 1);
                auVar109._24_4_ =
                     (uint)bVar12 * (int)auVar156._24_4_ | (uint)!bVar12 * auVar98._24_4_;
                auVar109._28_4_ = (uint)!SUB81(uVar62 >> 7,0) * auVar98._28_4_;
                auVar33._8_4_ = 0x40000000;
                auVar33._0_8_ = 0x4000000040000000;
                auVar33._12_4_ = 0x40000000;
                auVar33._16_4_ = 0x40000000;
                auVar33._20_4_ = 0x40000000;
                auVar33._24_4_ = 0x40000000;
                auVar33._28_4_ = 0x40000000;
                local_3a0 = vfmsub132ps_avx512vl(auVar109,auVar96,auVar33);
                local_360 = 0;
                local_350 = local_630._0_8_;
                uStack_348 = local_630._8_8_;
                local_340 = local_640._0_8_;
                uStack_338 = local_640._8_8_;
                local_330 = local_650._0_8_;
                uStack_328 = local_650._8_8_;
                if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (uVar65 = CONCAT71((int7)(uVar65 >> 8),1),
                     pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    fVar151 = 1.0 / auVar92._0_4_;
                    local_300[0] = fVar151 * (local_3c0._0_4_ + 0.0);
                    local_300[1] = fVar151 * (local_3c0._4_4_ + 1.0);
                    local_300[2] = fVar151 * (local_3c0._8_4_ + 2.0);
                    local_300[3] = fVar151 * (local_3c0._12_4_ + 3.0);
                    fStack_2f0 = fVar151 * (local_3c0._16_4_ + 4.0);
                    fStack_2ec = fVar151 * (local_3c0._20_4_ + 5.0);
                    fStack_2e8 = fVar151 * (local_3c0._24_4_ + 6.0);
                    fStack_2e4 = local_3c0._28_4_ + 7.0;
                    local_2e0 = local_3a0;
                    local_2c0 = local_380;
                    uVar62 = 0;
                    uVar66 = (ulong)((byte)uVar140 & bVar71);
                    for (uVar67 = uVar66; (uVar67 & 1) == 0;
                        uVar67 = uVar67 >> 1 | 0x8000000000000000) {
                      uVar62 = uVar62 + 1;
                    }
                    _local_400 = vpbroadcastd_avx512vl();
                    local_420 = vpbroadcastd_avx512vl();
                    local_540 = auVar88;
                    local_4e0 = auVar90;
                    local_35c = iVar8;
                    do {
                      auVar79 = auVar199._0_16_;
                      local_200 = local_300[uVar62];
                      local_1e0 = *(undefined4 *)(local_2e0 + uVar62 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2c0 + uVar62 * 4)
                      ;
                      local_6d0.context = context->user;
                      fVar138 = 1.0 - local_200;
                      fVar151 = fVar138 * fVar138 * -3.0;
                      auVar78 = vfmadd231ss_fma(ZEXT416((uint)(fVar138 * fVar138)),
                                                ZEXT416((uint)(local_200 * fVar138)),
                                                ZEXT416(0xc0000000));
                      auVar77 = vfmsub132ss_fma(ZEXT416((uint)(local_200 * fVar138)),
                                                ZEXT416((uint)(local_200 * local_200)),
                                                ZEXT416(0x40000000));
                      fVar138 = auVar78._0_4_ * 3.0;
                      fVar139 = auVar77._0_4_ * 3.0;
                      fVar174 = local_200 * local_200 * 3.0;
                      auVar169._0_4_ = fVar174 * (float)local_4b0._0_4_;
                      auVar169._4_4_ = fVar174 * (float)local_4b0._4_4_;
                      auVar169._8_4_ = fVar174 * fStack_4a8;
                      auVar169._12_4_ = fVar174 * fStack_4a4;
                      auVar134._4_4_ = fVar139;
                      auVar134._0_4_ = fVar139;
                      auVar134._8_4_ = fVar139;
                      auVar134._12_4_ = fVar139;
                      auVar78 = vfmadd132ps_fma(auVar134,auVar169,local_650);
                      auVar154._4_4_ = fVar138;
                      auVar154._0_4_ = fVar138;
                      auVar154._8_4_ = fVar138;
                      auVar154._12_4_ = fVar138;
                      auVar78 = vfmadd132ps_fma(auVar154,auVar78,local_640);
                      auVar135._4_4_ = fVar151;
                      auVar135._0_4_ = fVar151;
                      auVar135._8_4_ = fVar151;
                      auVar135._12_4_ = fVar151;
                      auVar78 = vfmadd132ps_fma(auVar135,auVar78,local_630);
                      local_260 = auVar78._0_4_;
                      auVar162._8_4_ = 1;
                      auVar162._0_8_ = 0x100000001;
                      auVar162._12_4_ = 1;
                      auVar162._16_4_ = 1;
                      auVar162._20_4_ = 1;
                      auVar162._24_4_ = 1;
                      auVar162._28_4_ = 1;
                      local_240 = vpermps_avx2(auVar162,ZEXT1632(auVar78));
                      auVar171._8_4_ = 2;
                      auVar171._0_8_ = 0x200000002;
                      auVar171._12_4_ = 2;
                      auVar171._16_4_ = 2;
                      auVar171._20_4_ = 2;
                      auVar171._24_4_ = 2;
                      auVar171._28_4_ = 2;
                      local_220 = vpermps_avx2(auVar171,ZEXT1632(auVar78));
                      uStack_25c = local_260;
                      uStack_258 = local_260;
                      uStack_254 = local_260;
                      uStack_250 = local_260;
                      uStack_24c = local_260;
                      uStack_248 = local_260;
                      uStack_244 = local_260;
                      fStack_1fc = local_200;
                      fStack_1f8 = local_200;
                      fStack_1f4 = local_200;
                      fStack_1f0 = local_200;
                      fStack_1ec = local_200;
                      fStack_1e8 = local_200;
                      fStack_1e4 = local_200;
                      uStack_1dc = local_1e0;
                      uStack_1d8 = local_1e0;
                      uStack_1d4 = local_1e0;
                      uStack_1d0 = local_1e0;
                      uStack_1cc = local_1e0;
                      uStack_1c8 = local_1e0;
                      uStack_1c4 = local_1e0;
                      local_1c0 = local_420._0_8_;
                      uStack_1b8 = local_420._8_8_;
                      uStack_1b0 = local_420._16_8_;
                      uStack_1a8 = local_420._24_8_;
                      local_1a0 = _local_400;
                      vpcmpeqd_avx2(_local_400,_local_400);
                      local_180 = (local_6d0.context)->instID[0];
                      uStack_17c = local_180;
                      uStack_178 = local_180;
                      uStack_174 = local_180;
                      uStack_170 = local_180;
                      uStack_16c = local_180;
                      uStack_168 = local_180;
                      uStack_164 = local_180;
                      local_160 = (local_6d0.context)->instPrimID[0];
                      uStack_15c = local_160;
                      uStack_158 = local_160;
                      uStack_154 = local_160;
                      uStack_150 = local_160;
                      uStack_14c = local_160;
                      uStack_148 = local_160;
                      uStack_144 = local_160;
                      local_5a0 = local_280;
                      local_6d0.valid = (int *)local_5a0;
                      local_6d0.geometryUserPtr = pGVar9->userPtr;
                      local_6d0.hit = (RTCHitN *)&local_260;
                      local_6d0.N = 8;
                      local_480 = (float)uVar66;
                      fStack_47c = (float)(uVar66 >> 0x20);
                      local_4a0 = (uint)uVar62;
                      uStack_49c = (uint)(uVar62 >> 0x20);
                      local_6d0.ray = (RTCRayN *)ray;
                      if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar9->occlusionFilterN)(&local_6d0);
                        uVar62 = CONCAT44(uStack_49c,local_4a0);
                        uVar66 = CONCAT44(fStack_47c,local_480);
                        auVar195 = ZEXT3264(local_4e0);
                        auVar194 = ZEXT3264(local_540);
                        auVar204 = ZEXT3264(local_620);
                        auVar203 = ZEXT3264(local_600);
                        auVar202 = ZEXT3264(local_5e0);
                        auVar205 = ZEXT3264(local_5c0);
                        auVar196 = ZEXT3264(local_6a0);
                        auVar197 = ZEXT3264(local_680);
                        auVar201 = ZEXT3264(local_520);
                        auVar200 = ZEXT3264(local_500);
                        auVar78 = vxorps_avx512vl(auVar79,auVar79);
                        auVar199 = ZEXT1664(auVar78);
                        uVar68 = local_560._0_4_;
                      }
                      auVar78 = auVar199._0_16_;
                      if (local_5a0 == (undefined1  [32])0x0) {
                        auVar98 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar198 = ZEXT3264(auVar98);
                      }
                      else {
                        p_Var11 = context->args->filter;
                        if (p_Var11 == (RTCFilterFunctionN)0x0) {
                          auVar98 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar198 = ZEXT3264(auVar98);
                        }
                        else {
                          auVar98 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar198 = ZEXT3264(auVar98);
                          if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar9->field_8).field_0x2 & 0x40) != 0)) {
                            (*p_Var11)(&local_6d0);
                            uVar62 = CONCAT44(uStack_49c,local_4a0);
                            uVar66 = CONCAT44(fStack_47c,local_480);
                            auVar195 = ZEXT3264(local_4e0);
                            auVar194 = ZEXT3264(local_540);
                            auVar204 = ZEXT3264(local_620);
                            auVar203 = ZEXT3264(local_600);
                            auVar202 = ZEXT3264(local_5e0);
                            auVar205 = ZEXT3264(local_5c0);
                            auVar196 = ZEXT3264(local_6a0);
                            auVar197 = ZEXT3264(local_680);
                            auVar201 = ZEXT3264(local_520);
                            auVar200 = ZEXT3264(local_500);
                            auVar78 = vxorps_avx512vl(auVar78,auVar78);
                            auVar199 = ZEXT1664(auVar78);
                            auVar98 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                            auVar198 = ZEXT3264(auVar98);
                            uVar68 = local_560._0_4_;
                          }
                        }
                        auVar88 = auVar194._0_32_;
                        uVar67 = vptestmd_avx512vl(local_5a0,local_5a0);
                        auVar98 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                        bVar12 = (bool)((byte)uVar67 & 1);
                        bVar13 = (bool)((byte)(uVar67 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar67 >> 2) & 1);
                        bVar15 = (bool)((byte)(uVar67 >> 3) & 1);
                        bVar16 = (bool)((byte)(uVar67 >> 4) & 1);
                        bVar17 = (bool)((byte)(uVar67 >> 5) & 1);
                        bVar18 = (bool)((byte)(uVar67 >> 6) & 1);
                        bVar19 = SUB81(uVar67 >> 7,0);
                        *(uint *)(local_6d0.ray + 0x100) =
                             (uint)bVar12 * auVar98._0_4_ |
                             (uint)!bVar12 * *(int *)(local_6d0.ray + 0x100);
                        *(uint *)(local_6d0.ray + 0x104) =
                             (uint)bVar13 * auVar98._4_4_ |
                             (uint)!bVar13 * *(int *)(local_6d0.ray + 0x104);
                        *(uint *)(local_6d0.ray + 0x108) =
                             (uint)bVar14 * auVar98._8_4_ |
                             (uint)!bVar14 * *(int *)(local_6d0.ray + 0x108);
                        *(uint *)(local_6d0.ray + 0x10c) =
                             (uint)bVar15 * auVar98._12_4_ |
                             (uint)!bVar15 * *(int *)(local_6d0.ray + 0x10c);
                        *(uint *)(local_6d0.ray + 0x110) =
                             (uint)bVar16 * auVar98._16_4_ |
                             (uint)!bVar16 * *(int *)(local_6d0.ray + 0x110);
                        *(uint *)(local_6d0.ray + 0x114) =
                             (uint)bVar17 * auVar98._20_4_ |
                             (uint)!bVar17 * *(int *)(local_6d0.ray + 0x114);
                        *(uint *)(local_6d0.ray + 0x118) =
                             (uint)bVar18 * auVar98._24_4_ |
                             (uint)!bVar18 * *(int *)(local_6d0.ray + 0x118);
                        *(uint *)(local_6d0.ray + 0x11c) =
                             (uint)bVar19 * auVar98._28_4_ |
                             (uint)!bVar19 * *(int *)(local_6d0.ray + 0x11c);
                        if (local_5a0 != (undefined1  [32])0x0) {
                          uVar65 = CONCAT71((int7)(uVar65 >> 8),1);
                          break;
                        }
                      }
                      auVar88 = auVar194._0_32_;
                      *(int *)(ray + k * 4 + 0x100) = auVar195._0_4_;
                      uVar67 = uVar62 & 0x3f;
                      uVar65 = 0;
                      uVar62 = 0;
                      uVar66 = uVar66 ^ 1L << uVar67;
                      for (uVar67 = uVar66; (uVar67 & 1) == 0;
                          uVar67 = uVar67 >> 1 | 0x8000000000000000) {
                        uVar62 = uVar62 + 1;
                      }
                    } while (uVar66 != 0);
                  }
                  goto LAB_01b82117;
                }
              }
            }
          }
          uVar65 = 0;
        }
      }
LAB_01b82117:
      if (8 < iVar8) {
        local_560 = vpbroadcastd_avx512vl();
        local_400._4_4_ = 1.0 / (float)local_460._0_4_;
        local_400._0_4_ = local_400._4_4_;
        fStack_3f8 = (float)local_400._4_4_;
        fStack_3f4 = (float)local_400._4_4_;
        fStack_3f0 = (float)local_400._4_4_;
        fStack_3ec = (float)local_400._4_4_;
        fStack_3e8 = (float)local_400._4_4_;
        fStack_3e4 = (float)local_400._4_4_;
        local_460 = vpbroadcastd_avx512vl();
        local_440 = vpbroadcastd_avx512vl();
        lVar69 = 8;
        local_540 = auVar88;
        local_4a0 = uVar68;
        uStack_49c = uVar68;
        uStack_498 = uVar68;
        uStack_494 = uVar68;
        uStack_490 = uVar68;
        uStack_48c = uVar68;
        uStack_488 = uVar68;
        uStack_484 = uVar68;
        local_480 = fVar128;
        fStack_47c = fVar128;
        fStack_478 = fVar128;
        fStack_474 = fVar128;
        fStack_470 = fVar128;
        fStack_46c = fVar128;
        fStack_468 = fVar128;
        fStack_464 = fVar128;
        do {
          auVar98 = vpbroadcastd_avx512vl();
          auVar83 = vpor_avx2(auVar98,_DAT_01fe9900);
          uVar26 = vpcmpd_avx512vl(auVar83,local_560,1);
          auVar98 = *(undefined1 (*) [32])(bezier_basis0 + lVar69 * 4 + lVar27);
          auVar100 = *(undefined1 (*) [32])(lVar27 + 0x21aa768 + lVar69 * 4);
          auVar96 = *(undefined1 (*) [32])(lVar27 + 0x21aabec + lVar69 * 4);
          auVar95 = *(undefined1 (*) [32])(lVar27 + 0x21ab070 + lVar69 * 4);
          local_600 = auVar203._0_32_;
          auVar84 = vmulps_avx512vl(local_600,auVar95);
          local_620 = auVar204._0_32_;
          auVar94 = vmulps_avx512vl(local_620,auVar95);
          auVar41._4_4_ = auVar95._4_4_ * (float)local_e0._4_4_;
          auVar41._0_4_ = auVar95._0_4_ * (float)local_e0._0_4_;
          auVar41._8_4_ = auVar95._8_4_ * fStack_d8;
          auVar41._12_4_ = auVar95._12_4_ * fStack_d4;
          auVar41._16_4_ = auVar95._16_4_ * fStack_d0;
          auVar41._20_4_ = auVar95._20_4_ * fStack_cc;
          auVar41._24_4_ = auVar95._24_4_ * fStack_c8;
          auVar41._28_4_ = auVar83._28_4_;
          local_5c0 = auVar205._0_32_;
          auVar83 = vfmadd231ps_avx512vl(auVar84,auVar96,local_5c0);
          local_5e0 = auVar202._0_32_;
          auVar84 = vfmadd231ps_avx512vl(auVar94,auVar96,local_5e0);
          auVar94 = vfmadd231ps_avx512vl(auVar41,auVar96,local_c0);
          auVar101 = auVar197._0_32_;
          auVar83 = vfmadd231ps_avx512vl(auVar83,auVar100,auVar101);
          auVar99 = auVar196._0_32_;
          auVar84 = vfmadd231ps_avx512vl(auVar84,auVar100,auVar99);
          auVar78 = vfmadd231ps_fma(auVar94,auVar100,local_a0);
          auVar102 = auVar200._0_32_;
          auVar87 = vfmadd231ps_avx512vl(auVar83,auVar98,auVar102);
          auVar103 = auVar201._0_32_;
          auVar89 = vfmadd231ps_avx512vl(auVar84,auVar98,auVar103);
          auVar83 = *(undefined1 (*) [32])(bezier_basis1 + lVar69 * 4 + lVar27);
          auVar84 = *(undefined1 (*) [32])(lVar27 + 0x21acb88 + lVar69 * 4);
          auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar98,local_80);
          auVar94 = *(undefined1 (*) [32])(lVar27 + 0x21ad00c + lVar69 * 4);
          auVar85 = *(undefined1 (*) [32])(lVar27 + 0x21ad490 + lVar69 * 4);
          auVar88 = vmulps_avx512vl(local_600,auVar85);
          auVar86 = vmulps_avx512vl(local_620,auVar85);
          auVar42._4_4_ = auVar85._4_4_ * (float)local_e0._4_4_;
          auVar42._0_4_ = auVar85._0_4_ * (float)local_e0._0_4_;
          auVar42._8_4_ = auVar85._8_4_ * fStack_d8;
          auVar42._12_4_ = auVar85._12_4_ * fStack_d4;
          auVar42._16_4_ = auVar85._16_4_ * fStack_d0;
          auVar42._20_4_ = auVar85._20_4_ * fStack_cc;
          auVar42._24_4_ = auVar85._24_4_ * fStack_c8;
          auVar42._28_4_ = uStack_c4;
          auVar88 = vfmadd231ps_avx512vl(auVar88,auVar94,local_5c0);
          auVar86 = vfmadd231ps_avx512vl(auVar86,auVar94,local_5e0);
          auVar90 = vfmadd231ps_avx512vl(auVar42,auVar94,local_c0);
          auVar88 = vfmadd231ps_avx512vl(auVar88,auVar84,auVar101);
          auVar86 = vfmadd231ps_avx512vl(auVar86,auVar84,auVar99);
          auVar77 = vfmadd231ps_fma(auVar90,auVar84,local_a0);
          auVar90 = vfmadd231ps_avx512vl(auVar88,auVar83,auVar102);
          auVar91 = vfmadd231ps_avx512vl(auVar86,auVar83,auVar103);
          auVar77 = vfmadd231ps_fma(ZEXT1632(auVar77),auVar83,local_80);
          auVar92 = vmaxps_avx512vl(ZEXT1632(auVar78),ZEXT1632(auVar77));
          auVar88 = vsubps_avx(auVar90,auVar87);
          auVar86 = vsubps_avx(auVar91,auVar89);
          auVar93 = vmulps_avx512vl(auVar89,auVar88);
          auVar97 = vmulps_avx512vl(auVar87,auVar86);
          auVar93 = vsubps_avx512vl(auVar93,auVar97);
          auVar97 = vmulps_avx512vl(auVar86,auVar86);
          auVar97 = vfmadd231ps_avx512vl(auVar97,auVar88,auVar88);
          auVar92 = vmulps_avx512vl(auVar92,auVar92);
          auVar92 = vmulps_avx512vl(auVar92,auVar97);
          auVar93 = vmulps_avx512vl(auVar93,auVar93);
          uVar140 = vcmpps_avx512vl(auVar93,auVar92,2);
          bVar71 = (byte)uVar26 & (byte)uVar140;
          if (bVar71 == 0) {
            auVar197 = ZEXT3264(auVar101);
            auVar196 = ZEXT3264(auVar99);
          }
          else {
            auVar85 = vmulps_avx512vl(local_540,auVar85);
            auVar94 = vfmadd213ps_avx512vl(auVar94,local_140,auVar85);
            auVar84 = vfmadd213ps_avx512vl(auVar84,local_120,auVar94);
            auVar83 = vfmadd213ps_avx512vl(auVar83,local_100,auVar84);
            auVar95 = vmulps_avx512vl(local_540,auVar95);
            auVar96 = vfmadd213ps_avx512vl(auVar96,local_140,auVar95);
            auVar100 = vfmadd213ps_avx512vl(auVar100,local_120,auVar96);
            auVar84 = vfmadd213ps_avx512vl(auVar98,local_100,auVar100);
            auVar98 = *(undefined1 (*) [32])(lVar27 + 0x21ab4f4 + lVar69 * 4);
            auVar100 = *(undefined1 (*) [32])(lVar27 + 0x21ab978 + lVar69 * 4);
            auVar96 = *(undefined1 (*) [32])(lVar27 + 0x21abdfc + lVar69 * 4);
            auVar95 = *(undefined1 (*) [32])(lVar27 + 0x21ac280 + lVar69 * 4);
            auVar94 = vmulps_avx512vl(local_600,auVar95);
            auVar85 = vmulps_avx512vl(local_620,auVar95);
            auVar95 = vmulps_avx512vl(local_540,auVar95);
            auVar94 = vfmadd231ps_avx512vl(auVar94,auVar96,local_5c0);
            auVar85 = vfmadd231ps_avx512vl(auVar85,auVar96,local_5e0);
            auVar96 = vfmadd231ps_avx512vl(auVar95,local_140,auVar96);
            auVar95 = vfmadd231ps_avx512vl(auVar94,auVar100,auVar101);
            auVar94 = vfmadd231ps_avx512vl(auVar85,auVar100,auVar99);
            auVar100 = vfmadd231ps_avx512vl(auVar96,local_120,auVar100);
            auVar95 = vfmadd231ps_avx512vl(auVar95,auVar98,auVar102);
            auVar94 = vfmadd231ps_avx512vl(auVar94,auVar98,auVar103);
            auVar85 = vfmadd231ps_avx512vl(auVar100,local_100,auVar98);
            auVar98 = *(undefined1 (*) [32])(lVar27 + 0x21ad914 + lVar69 * 4);
            auVar100 = *(undefined1 (*) [32])(lVar27 + 0x21ae21c + lVar69 * 4);
            auVar96 = *(undefined1 (*) [32])(lVar27 + 0x21ae6a0 + lVar69 * 4);
            auVar92 = vmulps_avx512vl(local_600,auVar96);
            auVar93 = vmulps_avx512vl(local_620,auVar96);
            auVar96 = vmulps_avx512vl(local_540,auVar96);
            auVar92 = vfmadd231ps_avx512vl(auVar92,auVar100,local_5c0);
            auVar93 = vfmadd231ps_avx512vl(auVar93,auVar100,local_5e0);
            auVar96 = vfmadd231ps_avx512vl(auVar96,local_140,auVar100);
            auVar100 = *(undefined1 (*) [32])(lVar27 + 0x21add98 + lVar69 * 4);
            auVar92 = vfmadd231ps_avx512vl(auVar92,auVar100,auVar101);
            auVar93 = vfmadd231ps_avx512vl(auVar93,auVar100,auVar99);
            auVar100 = vfmadd231ps_avx512vl(auVar96,local_120,auVar100);
            auVar96 = vfmadd231ps_avx512vl(auVar92,auVar98,auVar102);
            auVar92 = vfmadd231ps_avx512vl(auVar93,auVar98,auVar103);
            auVar100 = vfmadd231ps_avx512vl(auVar100,local_100,auVar98);
            auVar93 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar95,auVar93);
            vandps_avx512vl(auVar94,auVar93);
            auVar98 = vmaxps_avx(auVar93,auVar93);
            vandps_avx512vl(auVar85,auVar93);
            auVar98 = vmaxps_avx(auVar98,auVar93);
            auVar60._4_4_ = fStack_47c;
            auVar60._0_4_ = local_480;
            auVar60._8_4_ = fStack_478;
            auVar60._12_4_ = fStack_474;
            auVar60._16_4_ = fStack_470;
            auVar60._20_4_ = fStack_46c;
            auVar60._24_4_ = fStack_468;
            auVar60._28_4_ = fStack_464;
            uVar62 = vcmpps_avx512vl(auVar98,auVar60,1);
            bVar12 = (bool)((byte)uVar62 & 1);
            auVar110._0_4_ = (float)((uint)bVar12 * auVar88._0_4_ | (uint)!bVar12 * auVar95._0_4_);
            bVar12 = (bool)((byte)(uVar62 >> 1) & 1);
            auVar110._4_4_ = (float)((uint)bVar12 * auVar88._4_4_ | (uint)!bVar12 * auVar95._4_4_);
            bVar12 = (bool)((byte)(uVar62 >> 2) & 1);
            auVar110._8_4_ = (float)((uint)bVar12 * auVar88._8_4_ | (uint)!bVar12 * auVar95._8_4_);
            bVar12 = (bool)((byte)(uVar62 >> 3) & 1);
            auVar110._12_4_ =
                 (float)((uint)bVar12 * auVar88._12_4_ | (uint)!bVar12 * auVar95._12_4_);
            bVar12 = (bool)((byte)(uVar62 >> 4) & 1);
            auVar110._16_4_ =
                 (float)((uint)bVar12 * auVar88._16_4_ | (uint)!bVar12 * auVar95._16_4_);
            bVar12 = (bool)((byte)(uVar62 >> 5) & 1);
            auVar110._20_4_ =
                 (float)((uint)bVar12 * auVar88._20_4_ | (uint)!bVar12 * auVar95._20_4_);
            bVar12 = (bool)((byte)(uVar62 >> 6) & 1);
            auVar110._24_4_ =
                 (float)((uint)bVar12 * auVar88._24_4_ | (uint)!bVar12 * auVar95._24_4_);
            bVar12 = SUB81(uVar62 >> 7,0);
            auVar110._28_4_ = (uint)bVar12 * auVar88._28_4_ | (uint)!bVar12 * auVar95._28_4_;
            bVar12 = (bool)((byte)uVar62 & 1);
            auVar111._0_4_ = (float)((uint)bVar12 * auVar86._0_4_ | (uint)!bVar12 * auVar94._0_4_);
            bVar12 = (bool)((byte)(uVar62 >> 1) & 1);
            auVar111._4_4_ = (float)((uint)bVar12 * auVar86._4_4_ | (uint)!bVar12 * auVar94._4_4_);
            bVar12 = (bool)((byte)(uVar62 >> 2) & 1);
            auVar111._8_4_ = (float)((uint)bVar12 * auVar86._8_4_ | (uint)!bVar12 * auVar94._8_4_);
            bVar12 = (bool)((byte)(uVar62 >> 3) & 1);
            auVar111._12_4_ =
                 (float)((uint)bVar12 * auVar86._12_4_ | (uint)!bVar12 * auVar94._12_4_);
            bVar12 = (bool)((byte)(uVar62 >> 4) & 1);
            auVar111._16_4_ =
                 (float)((uint)bVar12 * auVar86._16_4_ | (uint)!bVar12 * auVar94._16_4_);
            bVar12 = (bool)((byte)(uVar62 >> 5) & 1);
            auVar111._20_4_ =
                 (float)((uint)bVar12 * auVar86._20_4_ | (uint)!bVar12 * auVar94._20_4_);
            bVar12 = (bool)((byte)(uVar62 >> 6) & 1);
            auVar111._24_4_ =
                 (float)((uint)bVar12 * auVar86._24_4_ | (uint)!bVar12 * auVar94._24_4_);
            bVar12 = SUB81(uVar62 >> 7,0);
            auVar111._28_4_ = (uint)bVar12 * auVar86._28_4_ | (uint)!bVar12 * auVar94._28_4_;
            vandps_avx512vl(auVar96,auVar93);
            vandps_avx512vl(auVar92,auVar93);
            auVar98 = vmaxps_avx(auVar111,auVar111);
            vandps_avx512vl(auVar100,auVar93);
            auVar98 = vmaxps_avx(auVar98,auVar111);
            uVar62 = vcmpps_avx512vl(auVar98,auVar60,1);
            bVar12 = (bool)((byte)uVar62 & 1);
            auVar112._0_4_ = (uint)bVar12 * auVar88._0_4_ | (uint)!bVar12 * auVar96._0_4_;
            bVar12 = (bool)((byte)(uVar62 >> 1) & 1);
            auVar112._4_4_ = (uint)bVar12 * auVar88._4_4_ | (uint)!bVar12 * auVar96._4_4_;
            bVar12 = (bool)((byte)(uVar62 >> 2) & 1);
            auVar112._8_4_ = (uint)bVar12 * auVar88._8_4_ | (uint)!bVar12 * auVar96._8_4_;
            bVar12 = (bool)((byte)(uVar62 >> 3) & 1);
            auVar112._12_4_ = (uint)bVar12 * auVar88._12_4_ | (uint)!bVar12 * auVar96._12_4_;
            bVar12 = (bool)((byte)(uVar62 >> 4) & 1);
            auVar112._16_4_ = (uint)bVar12 * auVar88._16_4_ | (uint)!bVar12 * auVar96._16_4_;
            bVar12 = (bool)((byte)(uVar62 >> 5) & 1);
            auVar112._20_4_ = (uint)bVar12 * auVar88._20_4_ | (uint)!bVar12 * auVar96._20_4_;
            bVar12 = (bool)((byte)(uVar62 >> 6) & 1);
            auVar112._24_4_ = (uint)bVar12 * auVar88._24_4_ | (uint)!bVar12 * auVar96._24_4_;
            bVar12 = SUB81(uVar62 >> 7,0);
            auVar112._28_4_ = (uint)bVar12 * auVar88._28_4_ | (uint)!bVar12 * auVar96._28_4_;
            bVar12 = (bool)((byte)uVar62 & 1);
            auVar113._0_4_ = (float)((uint)bVar12 * auVar86._0_4_ | (uint)!bVar12 * auVar92._0_4_);
            bVar12 = (bool)((byte)(uVar62 >> 1) & 1);
            auVar113._4_4_ = (float)((uint)bVar12 * auVar86._4_4_ | (uint)!bVar12 * auVar92._4_4_);
            bVar12 = (bool)((byte)(uVar62 >> 2) & 1);
            auVar113._8_4_ = (float)((uint)bVar12 * auVar86._8_4_ | (uint)!bVar12 * auVar92._8_4_);
            bVar12 = (bool)((byte)(uVar62 >> 3) & 1);
            auVar113._12_4_ =
                 (float)((uint)bVar12 * auVar86._12_4_ | (uint)!bVar12 * auVar92._12_4_);
            bVar12 = (bool)((byte)(uVar62 >> 4) & 1);
            auVar113._16_4_ =
                 (float)((uint)bVar12 * auVar86._16_4_ | (uint)!bVar12 * auVar92._16_4_);
            bVar12 = (bool)((byte)(uVar62 >> 5) & 1);
            auVar113._20_4_ =
                 (float)((uint)bVar12 * auVar86._20_4_ | (uint)!bVar12 * auVar92._20_4_);
            bVar12 = (bool)((byte)(uVar62 >> 6) & 1);
            auVar113._24_4_ =
                 (float)((uint)bVar12 * auVar86._24_4_ | (uint)!bVar12 * auVar92._24_4_);
            bVar12 = SUB81(uVar62 >> 7,0);
            auVar113._28_4_ = (uint)bVar12 * auVar86._28_4_ | (uint)!bVar12 * auVar92._28_4_;
            auVar184._8_4_ = 0x80000000;
            auVar184._0_8_ = 0x8000000080000000;
            auVar184._12_4_ = 0x80000000;
            auVar184._16_4_ = 0x80000000;
            auVar184._20_4_ = 0x80000000;
            auVar184._24_4_ = 0x80000000;
            auVar184._28_4_ = 0x80000000;
            auVar98 = vxorps_avx512vl(auVar112,auVar184);
            auVar92 = auVar199._0_32_;
            auVar100 = vfmadd213ps_avx512vl(auVar110,auVar110,auVar92);
            auVar79 = vfmadd231ps_fma(auVar100,auVar111,auVar111);
            auVar100 = vrsqrt14ps_avx512vl(ZEXT1632(auVar79));
            auVar193._8_4_ = 0xbf000000;
            auVar193._0_8_ = 0xbf000000bf000000;
            auVar193._12_4_ = 0xbf000000;
            auVar193._16_4_ = 0xbf000000;
            auVar193._20_4_ = 0xbf000000;
            auVar193._24_4_ = 0xbf000000;
            auVar193._28_4_ = 0xbf000000;
            fVar128 = auVar100._0_4_;
            fVar151 = auVar100._4_4_;
            fVar138 = auVar100._8_4_;
            fVar139 = auVar100._12_4_;
            fVar174 = auVar100._16_4_;
            fVar173 = auVar100._20_4_;
            fVar177 = auVar100._24_4_;
            auVar43._4_4_ = fVar151 * fVar151 * fVar151 * auVar79._4_4_ * -0.5;
            auVar43._0_4_ = fVar128 * fVar128 * fVar128 * auVar79._0_4_ * -0.5;
            auVar43._8_4_ = fVar138 * fVar138 * fVar138 * auVar79._8_4_ * -0.5;
            auVar43._12_4_ = fVar139 * fVar139 * fVar139 * auVar79._12_4_ * -0.5;
            auVar43._16_4_ = fVar174 * fVar174 * fVar174 * -0.0;
            auVar43._20_4_ = fVar173 * fVar173 * fVar173 * -0.0;
            auVar43._24_4_ = fVar177 * fVar177 * fVar177 * -0.0;
            auVar43._28_4_ = auVar111._28_4_;
            auVar96 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar100 = vfmadd231ps_avx512vl(auVar43,auVar96,auVar100);
            auVar44._4_4_ = auVar111._4_4_ * auVar100._4_4_;
            auVar44._0_4_ = auVar111._0_4_ * auVar100._0_4_;
            auVar44._8_4_ = auVar111._8_4_ * auVar100._8_4_;
            auVar44._12_4_ = auVar111._12_4_ * auVar100._12_4_;
            auVar44._16_4_ = auVar111._16_4_ * auVar100._16_4_;
            auVar44._20_4_ = auVar111._20_4_ * auVar100._20_4_;
            auVar44._24_4_ = auVar111._24_4_ * auVar100._24_4_;
            auVar44._28_4_ = 0;
            auVar45._4_4_ = auVar100._4_4_ * -auVar110._4_4_;
            auVar45._0_4_ = auVar100._0_4_ * -auVar110._0_4_;
            auVar45._8_4_ = auVar100._8_4_ * -auVar110._8_4_;
            auVar45._12_4_ = auVar100._12_4_ * -auVar110._12_4_;
            auVar45._16_4_ = auVar100._16_4_ * -auVar110._16_4_;
            auVar45._20_4_ = auVar100._20_4_ * -auVar110._20_4_;
            auVar45._24_4_ = auVar100._24_4_ * -auVar110._24_4_;
            auVar45._28_4_ = auVar111._28_4_;
            auVar95 = vmulps_avx512vl(auVar100,auVar92);
            auVar100 = vfmadd213ps_avx512vl(auVar112,auVar112,auVar92);
            auVar100 = vfmadd231ps_avx512vl(auVar100,auVar113,auVar113);
            auVar94 = vrsqrt14ps_avx512vl(auVar100);
            auVar100 = vmulps_avx512vl(auVar100,auVar193);
            fVar128 = auVar94._0_4_;
            fVar151 = auVar94._4_4_;
            fVar138 = auVar94._8_4_;
            fVar139 = auVar94._12_4_;
            fVar174 = auVar94._16_4_;
            fVar173 = auVar94._20_4_;
            fVar177 = auVar94._24_4_;
            auVar46._4_4_ = fVar151 * fVar151 * fVar151 * auVar100._4_4_;
            auVar46._0_4_ = fVar128 * fVar128 * fVar128 * auVar100._0_4_;
            auVar46._8_4_ = fVar138 * fVar138 * fVar138 * auVar100._8_4_;
            auVar46._12_4_ = fVar139 * fVar139 * fVar139 * auVar100._12_4_;
            auVar46._16_4_ = fVar174 * fVar174 * fVar174 * auVar100._16_4_;
            auVar46._20_4_ = fVar173 * fVar173 * fVar173 * auVar100._20_4_;
            auVar46._24_4_ = fVar177 * fVar177 * fVar177 * auVar100._24_4_;
            auVar46._28_4_ = auVar100._28_4_;
            auVar100 = vfmadd231ps_avx512vl(auVar46,auVar96,auVar94);
            auVar47._4_4_ = auVar113._4_4_ * auVar100._4_4_;
            auVar47._0_4_ = auVar113._0_4_ * auVar100._0_4_;
            auVar47._8_4_ = auVar113._8_4_ * auVar100._8_4_;
            auVar47._12_4_ = auVar113._12_4_ * auVar100._12_4_;
            auVar47._16_4_ = auVar113._16_4_ * auVar100._16_4_;
            auVar47._20_4_ = auVar113._20_4_ * auVar100._20_4_;
            auVar47._24_4_ = auVar113._24_4_ * auVar100._24_4_;
            auVar47._28_4_ = auVar94._28_4_;
            auVar48._4_4_ = auVar100._4_4_ * auVar98._4_4_;
            auVar48._0_4_ = auVar100._0_4_ * auVar98._0_4_;
            auVar48._8_4_ = auVar100._8_4_ * auVar98._8_4_;
            auVar48._12_4_ = auVar100._12_4_ * auVar98._12_4_;
            auVar48._16_4_ = auVar100._16_4_ * auVar98._16_4_;
            auVar48._20_4_ = auVar100._20_4_ * auVar98._20_4_;
            auVar48._24_4_ = auVar100._24_4_ * auVar98._24_4_;
            auVar48._28_4_ = auVar98._28_4_;
            auVar98 = vmulps_avx512vl(auVar100,auVar92);
            auVar79 = vfmadd213ps_fma(auVar44,ZEXT1632(auVar78),auVar87);
            auVar100 = ZEXT1632(auVar78);
            auVar20 = vfmadd213ps_fma(auVar45,auVar100,auVar89);
            auVar96 = vfmadd213ps_avx512vl(auVar95,auVar100,auVar84);
            auVar94 = vfmadd213ps_avx512vl(auVar47,ZEXT1632(auVar77),auVar90);
            auVar25 = vfnmadd213ps_fma(auVar44,auVar100,auVar87);
            auVar85 = ZEXT1632(auVar77);
            auVar21 = vfmadd213ps_fma(auVar48,auVar85,auVar91);
            auVar80 = vfnmadd213ps_fma(auVar45,auVar100,auVar89);
            auVar22 = vfmadd213ps_fma(auVar98,auVar85,auVar83);
            auVar89 = ZEXT1632(auVar78);
            auVar82 = vfnmadd231ps_fma(auVar84,auVar89,auVar95);
            auVar81 = vfnmadd213ps_fma(auVar47,auVar85,auVar90);
            auVar29 = vfnmadd213ps_fma(auVar48,auVar85,auVar91);
            auVar30 = vfnmadd231ps_fma(auVar83,ZEXT1632(auVar77),auVar98);
            auVar83 = vsubps_avx512vl(auVar94,ZEXT1632(auVar25));
            auVar98 = vsubps_avx(ZEXT1632(auVar21),ZEXT1632(auVar80));
            auVar100 = vsubps_avx(ZEXT1632(auVar22),ZEXT1632(auVar82));
            auVar49._4_4_ = auVar98._4_4_ * auVar82._4_4_;
            auVar49._0_4_ = auVar98._0_4_ * auVar82._0_4_;
            auVar49._8_4_ = auVar98._8_4_ * auVar82._8_4_;
            auVar49._12_4_ = auVar98._12_4_ * auVar82._12_4_;
            auVar49._16_4_ = auVar98._16_4_ * 0.0;
            auVar49._20_4_ = auVar98._20_4_ * 0.0;
            auVar49._24_4_ = auVar98._24_4_ * 0.0;
            auVar49._28_4_ = auVar95._28_4_;
            auVar78 = vfmsub231ps_fma(auVar49,ZEXT1632(auVar80),auVar100);
            auVar50._4_4_ = auVar100._4_4_ * auVar25._4_4_;
            auVar50._0_4_ = auVar100._0_4_ * auVar25._0_4_;
            auVar50._8_4_ = auVar100._8_4_ * auVar25._8_4_;
            auVar50._12_4_ = auVar100._12_4_ * auVar25._12_4_;
            auVar50._16_4_ = auVar100._16_4_ * 0.0;
            auVar50._20_4_ = auVar100._20_4_ * 0.0;
            auVar50._24_4_ = auVar100._24_4_ * 0.0;
            auVar50._28_4_ = auVar100._28_4_;
            auVar23 = vfmsub231ps_fma(auVar50,ZEXT1632(auVar82),auVar83);
            auVar51._4_4_ = auVar80._4_4_ * auVar83._4_4_;
            auVar51._0_4_ = auVar80._0_4_ * auVar83._0_4_;
            auVar51._8_4_ = auVar80._8_4_ * auVar83._8_4_;
            auVar51._12_4_ = auVar80._12_4_ * auVar83._12_4_;
            auVar51._16_4_ = auVar83._16_4_ * 0.0;
            auVar51._20_4_ = auVar83._20_4_ * 0.0;
            auVar51._24_4_ = auVar83._24_4_ * 0.0;
            auVar51._28_4_ = auVar83._28_4_;
            auVar24 = vfmsub231ps_fma(auVar51,ZEXT1632(auVar25),auVar98);
            auVar98 = vfmadd231ps_avx512vl(ZEXT1632(auVar24),auVar92,ZEXT1632(auVar23));
            auVar98 = vfmadd231ps_avx512vl(auVar98,auVar92,ZEXT1632(auVar78));
            uVar62 = vcmpps_avx512vl(auVar98,auVar92,2);
            bVar61 = (byte)uVar62;
            fVar120 = (float)((uint)(bVar61 & 1) * auVar79._0_4_ |
                             (uint)!(bool)(bVar61 & 1) * auVar81._0_4_);
            bVar12 = (bool)((byte)(uVar62 >> 1) & 1);
            fVar122 = (float)((uint)bVar12 * auVar79._4_4_ | (uint)!bVar12 * auVar81._4_4_);
            bVar12 = (bool)((byte)(uVar62 >> 2) & 1);
            fVar124 = (float)((uint)bVar12 * auVar79._8_4_ | (uint)!bVar12 * auVar81._8_4_);
            bVar12 = (bool)((byte)(uVar62 >> 3) & 1);
            fVar126 = (float)((uint)bVar12 * auVar79._12_4_ | (uint)!bVar12 * auVar81._12_4_);
            auVar85 = ZEXT1632(CONCAT412(fVar126,CONCAT48(fVar124,CONCAT44(fVar122,fVar120))));
            fVar121 = (float)((uint)(bVar61 & 1) * auVar20._0_4_ |
                             (uint)!(bool)(bVar61 & 1) * auVar29._0_4_);
            bVar12 = (bool)((byte)(uVar62 >> 1) & 1);
            fVar123 = (float)((uint)bVar12 * auVar20._4_4_ | (uint)!bVar12 * auVar29._4_4_);
            bVar12 = (bool)((byte)(uVar62 >> 2) & 1);
            fVar125 = (float)((uint)bVar12 * auVar20._8_4_ | (uint)!bVar12 * auVar29._8_4_);
            bVar12 = (bool)((byte)(uVar62 >> 3) & 1);
            fVar127 = (float)((uint)bVar12 * auVar20._12_4_ | (uint)!bVar12 * auVar29._12_4_);
            auVar88 = ZEXT1632(CONCAT412(fVar127,CONCAT48(fVar125,CONCAT44(fVar123,fVar121))));
            auVar114._0_4_ =
                 (float)((uint)(bVar61 & 1) * auVar96._0_4_ |
                        (uint)!(bool)(bVar61 & 1) * auVar30._0_4_);
            bVar12 = (bool)((byte)(uVar62 >> 1) & 1);
            auVar114._4_4_ = (float)((uint)bVar12 * auVar96._4_4_ | (uint)!bVar12 * auVar30._4_4_);
            bVar12 = (bool)((byte)(uVar62 >> 2) & 1);
            auVar114._8_4_ = (float)((uint)bVar12 * auVar96._8_4_ | (uint)!bVar12 * auVar30._8_4_);
            bVar12 = (bool)((byte)(uVar62 >> 3) & 1);
            auVar114._12_4_ =
                 (float)((uint)bVar12 * auVar96._12_4_ | (uint)!bVar12 * auVar30._12_4_);
            fVar128 = (float)((uint)((byte)(uVar62 >> 4) & 1) * auVar96._16_4_);
            auVar114._16_4_ = fVar128;
            fVar138 = (float)((uint)((byte)(uVar62 >> 5) & 1) * auVar96._20_4_);
            auVar114._20_4_ = fVar138;
            fVar151 = (float)((uint)((byte)(uVar62 >> 6) & 1) * auVar96._24_4_);
            auVar114._24_4_ = fVar151;
            iVar1 = (uint)(byte)(uVar62 >> 7) * auVar96._28_4_;
            auVar114._28_4_ = iVar1;
            auVar98 = vblendmps_avx512vl(ZEXT1632(auVar25),auVar94);
            auVar115._0_4_ =
                 (uint)(bVar61 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar78._0_4_;
            bVar12 = (bool)((byte)(uVar62 >> 1) & 1);
            auVar115._4_4_ = (uint)bVar12 * auVar98._4_4_ | (uint)!bVar12 * auVar78._4_4_;
            bVar12 = (bool)((byte)(uVar62 >> 2) & 1);
            auVar115._8_4_ = (uint)bVar12 * auVar98._8_4_ | (uint)!bVar12 * auVar78._8_4_;
            bVar12 = (bool)((byte)(uVar62 >> 3) & 1);
            auVar115._12_4_ = (uint)bVar12 * auVar98._12_4_ | (uint)!bVar12 * auVar78._12_4_;
            auVar115._16_4_ = (uint)((byte)(uVar62 >> 4) & 1) * auVar98._16_4_;
            auVar115._20_4_ = (uint)((byte)(uVar62 >> 5) & 1) * auVar98._20_4_;
            auVar115._24_4_ = (uint)((byte)(uVar62 >> 6) & 1) * auVar98._24_4_;
            auVar115._28_4_ = (uint)(byte)(uVar62 >> 7) * auVar98._28_4_;
            auVar98 = vblendmps_avx512vl(ZEXT1632(auVar80),ZEXT1632(auVar21));
            auVar116._0_4_ =
                 (float)((uint)(bVar61 & 1) * auVar98._0_4_ |
                        (uint)!(bool)(bVar61 & 1) * auVar79._0_4_);
            bVar12 = (bool)((byte)(uVar62 >> 1) & 1);
            auVar116._4_4_ = (float)((uint)bVar12 * auVar98._4_4_ | (uint)!bVar12 * auVar79._4_4_);
            bVar12 = (bool)((byte)(uVar62 >> 2) & 1);
            auVar116._8_4_ = (float)((uint)bVar12 * auVar98._8_4_ | (uint)!bVar12 * auVar79._8_4_);
            bVar12 = (bool)((byte)(uVar62 >> 3) & 1);
            auVar116._12_4_ =
                 (float)((uint)bVar12 * auVar98._12_4_ | (uint)!bVar12 * auVar79._12_4_);
            fVar173 = (float)((uint)((byte)(uVar62 >> 4) & 1) * auVar98._16_4_);
            auVar116._16_4_ = fVar173;
            fVar174 = (float)((uint)((byte)(uVar62 >> 5) & 1) * auVar98._20_4_);
            auVar116._20_4_ = fVar174;
            fVar139 = (float)((uint)((byte)(uVar62 >> 6) & 1) * auVar98._24_4_);
            auVar116._24_4_ = fVar139;
            auVar116._28_4_ = (uint)(byte)(uVar62 >> 7) * auVar98._28_4_;
            auVar98 = vblendmps_avx512vl(ZEXT1632(auVar82),ZEXT1632(auVar22));
            auVar117._0_4_ =
                 (float)((uint)(bVar61 & 1) * auVar98._0_4_ |
                        (uint)!(bool)(bVar61 & 1) * auVar20._0_4_);
            bVar12 = (bool)((byte)(uVar62 >> 1) & 1);
            auVar117._4_4_ = (float)((uint)bVar12 * auVar98._4_4_ | (uint)!bVar12 * auVar20._4_4_);
            bVar12 = (bool)((byte)(uVar62 >> 2) & 1);
            auVar117._8_4_ = (float)((uint)bVar12 * auVar98._8_4_ | (uint)!bVar12 * auVar20._8_4_);
            bVar12 = (bool)((byte)(uVar62 >> 3) & 1);
            auVar117._12_4_ =
                 (float)((uint)bVar12 * auVar98._12_4_ | (uint)!bVar12 * auVar20._12_4_);
            fVar72 = (float)((uint)((byte)(uVar62 >> 4) & 1) * auVar98._16_4_);
            auVar117._16_4_ = fVar72;
            fVar177 = (float)((uint)((byte)(uVar62 >> 5) & 1) * auVar98._20_4_);
            auVar117._20_4_ = fVar177;
            fVar73 = (float)((uint)((byte)(uVar62 >> 6) & 1) * auVar98._24_4_);
            auVar117._24_4_ = fVar73;
            iVar2 = (uint)(byte)(uVar62 >> 7) * auVar98._28_4_;
            auVar117._28_4_ = iVar2;
            auVar118._0_4_ =
                 (uint)(bVar61 & 1) * (int)auVar25._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar94._0_4_
            ;
            bVar12 = (bool)((byte)(uVar62 >> 1) & 1);
            auVar118._4_4_ = (uint)bVar12 * (int)auVar25._4_4_ | (uint)!bVar12 * auVar94._4_4_;
            bVar12 = (bool)((byte)(uVar62 >> 2) & 1);
            auVar118._8_4_ = (uint)bVar12 * (int)auVar25._8_4_ | (uint)!bVar12 * auVar94._8_4_;
            bVar12 = (bool)((byte)(uVar62 >> 3) & 1);
            auVar118._12_4_ = (uint)bVar12 * (int)auVar25._12_4_ | (uint)!bVar12 * auVar94._12_4_;
            auVar118._16_4_ = (uint)!(bool)((byte)(uVar62 >> 4) & 1) * auVar94._16_4_;
            auVar118._20_4_ = (uint)!(bool)((byte)(uVar62 >> 5) & 1) * auVar94._20_4_;
            auVar118._24_4_ = (uint)!(bool)((byte)(uVar62 >> 6) & 1) * auVar94._24_4_;
            auVar118._28_4_ = (uint)!SUB81(uVar62 >> 7,0) * auVar94._28_4_;
            bVar12 = (bool)((byte)(uVar62 >> 1) & 1);
            bVar14 = (bool)((byte)(uVar62 >> 2) & 1);
            bVar16 = (bool)((byte)(uVar62 >> 3) & 1);
            bVar13 = (bool)((byte)(uVar62 >> 1) & 1);
            bVar15 = (bool)((byte)(uVar62 >> 2) & 1);
            bVar17 = (bool)((byte)(uVar62 >> 3) & 1);
            auVar94 = vsubps_avx512vl(auVar118,auVar85);
            auVar100 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar80._12_4_ |
                                                     (uint)!bVar16 * auVar21._12_4_,
                                                     CONCAT48((uint)bVar14 * (int)auVar80._8_4_ |
                                                              (uint)!bVar14 * auVar21._8_4_,
                                                              CONCAT44((uint)bVar12 *
                                                                       (int)auVar80._4_4_ |
                                                                       (uint)!bVar12 * auVar21._4_4_
                                                                       ,(uint)(bVar61 & 1) *
                                                                        (int)auVar80._0_4_ |
                                                                        (uint)!(bool)(bVar61 & 1) *
                                                                        auVar21._0_4_)))),auVar88);
            auVar96 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar82._12_4_ |
                                                    (uint)!bVar17 * auVar22._12_4_,
                                                    CONCAT48((uint)bVar15 * (int)auVar82._8_4_ |
                                                             (uint)!bVar15 * auVar22._8_4_,
                                                             CONCAT44((uint)bVar13 *
                                                                      (int)auVar82._4_4_ |
                                                                      (uint)!bVar13 * auVar22._4_4_,
                                                                      (uint)(bVar61 & 1) *
                                                                      (int)auVar82._0_4_ |
                                                                      (uint)!(bool)(bVar61 & 1) *
                                                                      auVar22._0_4_)))),auVar114);
            auVar95 = vsubps_avx(auVar85,auVar115);
            auVar83 = vsubps_avx(auVar88,auVar116);
            auVar84 = vsubps_avx(auVar114,auVar117);
            auVar52._4_4_ = auVar96._4_4_ * fVar122;
            auVar52._0_4_ = auVar96._0_4_ * fVar120;
            auVar52._8_4_ = auVar96._8_4_ * fVar124;
            auVar52._12_4_ = auVar96._12_4_ * fVar126;
            auVar52._16_4_ = auVar96._16_4_ * 0.0;
            auVar52._20_4_ = auVar96._20_4_ * 0.0;
            auVar52._24_4_ = auVar96._24_4_ * 0.0;
            auVar52._28_4_ = 0;
            auVar78 = vfmsub231ps_fma(auVar52,auVar114,auVar94);
            auVar157._0_4_ = fVar121 * auVar94._0_4_;
            auVar157._4_4_ = fVar123 * auVar94._4_4_;
            auVar157._8_4_ = fVar125 * auVar94._8_4_;
            auVar157._12_4_ = fVar127 * auVar94._12_4_;
            auVar157._16_4_ = auVar94._16_4_ * 0.0;
            auVar157._20_4_ = auVar94._20_4_ * 0.0;
            auVar157._24_4_ = auVar94._24_4_ * 0.0;
            auVar157._28_4_ = 0;
            auVar79 = vfmsub231ps_fma(auVar157,auVar85,auVar100);
            auVar98 = vfmadd231ps_avx512vl(ZEXT1632(auVar79),auVar92,ZEXT1632(auVar78));
            auVar163._0_4_ = auVar100._0_4_ * auVar114._0_4_;
            auVar163._4_4_ = auVar100._4_4_ * auVar114._4_4_;
            auVar163._8_4_ = auVar100._8_4_ * auVar114._8_4_;
            auVar163._12_4_ = auVar100._12_4_ * auVar114._12_4_;
            auVar163._16_4_ = auVar100._16_4_ * fVar128;
            auVar163._20_4_ = auVar100._20_4_ * fVar138;
            auVar163._24_4_ = auVar100._24_4_ * fVar151;
            auVar163._28_4_ = 0;
            auVar78 = vfmsub231ps_fma(auVar163,auVar88,auVar96);
            auVar86 = vfmadd231ps_avx512vl(auVar98,auVar92,ZEXT1632(auVar78));
            auVar98 = vmulps_avx512vl(auVar84,auVar115);
            auVar98 = vfmsub231ps_avx512vl(auVar98,auVar95,auVar117);
            auVar53._4_4_ = auVar83._4_4_ * auVar117._4_4_;
            auVar53._0_4_ = auVar83._0_4_ * auVar117._0_4_;
            auVar53._8_4_ = auVar83._8_4_ * auVar117._8_4_;
            auVar53._12_4_ = auVar83._12_4_ * auVar117._12_4_;
            auVar53._16_4_ = auVar83._16_4_ * fVar72;
            auVar53._20_4_ = auVar83._20_4_ * fVar177;
            auVar53._24_4_ = auVar83._24_4_ * fVar73;
            auVar53._28_4_ = iVar2;
            auVar78 = vfmsub231ps_fma(auVar53,auVar116,auVar84);
            auVar164._0_4_ = auVar116._0_4_ * auVar95._0_4_;
            auVar164._4_4_ = auVar116._4_4_ * auVar95._4_4_;
            auVar164._8_4_ = auVar116._8_4_ * auVar95._8_4_;
            auVar164._12_4_ = auVar116._12_4_ * auVar95._12_4_;
            auVar164._16_4_ = fVar173 * auVar95._16_4_;
            auVar164._20_4_ = fVar174 * auVar95._20_4_;
            auVar164._24_4_ = fVar139 * auVar95._24_4_;
            auVar164._28_4_ = 0;
            auVar79 = vfmsub231ps_fma(auVar164,auVar83,auVar115);
            auVar98 = vfmadd231ps_avx512vl(ZEXT1632(auVar79),auVar92,auVar98);
            auVar87 = vfmadd231ps_avx512vl(auVar98,auVar92,ZEXT1632(auVar78));
            auVar98 = vmaxps_avx(auVar86,auVar87);
            uVar140 = vcmpps_avx512vl(auVar98,auVar92,2);
            bVar71 = bVar71 & (byte)uVar140;
            if (bVar71 != 0) {
              uVar129 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar190._4_4_ = uVar129;
              auVar190._0_4_ = uVar129;
              auVar190._8_4_ = uVar129;
              auVar190._12_4_ = uVar129;
              auVar190._16_4_ = uVar129;
              auVar190._20_4_ = uVar129;
              auVar190._24_4_ = uVar129;
              auVar190._28_4_ = uVar129;
              auVar194 = ZEXT3264(auVar190);
              auVar54._4_4_ = auVar84._4_4_ * auVar100._4_4_;
              auVar54._0_4_ = auVar84._0_4_ * auVar100._0_4_;
              auVar54._8_4_ = auVar84._8_4_ * auVar100._8_4_;
              auVar54._12_4_ = auVar84._12_4_ * auVar100._12_4_;
              auVar54._16_4_ = auVar84._16_4_ * auVar100._16_4_;
              auVar54._20_4_ = auVar84._20_4_ * auVar100._20_4_;
              auVar54._24_4_ = auVar84._24_4_ * auVar100._24_4_;
              auVar54._28_4_ = auVar98._28_4_;
              auVar20 = vfmsub231ps_fma(auVar54,auVar83,auVar96);
              auVar55._4_4_ = auVar96._4_4_ * auVar95._4_4_;
              auVar55._0_4_ = auVar96._0_4_ * auVar95._0_4_;
              auVar55._8_4_ = auVar96._8_4_ * auVar95._8_4_;
              auVar55._12_4_ = auVar96._12_4_ * auVar95._12_4_;
              auVar55._16_4_ = auVar96._16_4_ * auVar95._16_4_;
              auVar55._20_4_ = auVar96._20_4_ * auVar95._20_4_;
              auVar55._24_4_ = auVar96._24_4_ * auVar95._24_4_;
              auVar55._28_4_ = auVar96._28_4_;
              auVar79 = vfmsub231ps_fma(auVar55,auVar94,auVar84);
              auVar56._4_4_ = auVar83._4_4_ * auVar94._4_4_;
              auVar56._0_4_ = auVar83._0_4_ * auVar94._0_4_;
              auVar56._8_4_ = auVar83._8_4_ * auVar94._8_4_;
              auVar56._12_4_ = auVar83._12_4_ * auVar94._12_4_;
              auVar56._16_4_ = auVar83._16_4_ * auVar94._16_4_;
              auVar56._20_4_ = auVar83._20_4_ * auVar94._20_4_;
              auVar56._24_4_ = auVar83._24_4_ * auVar94._24_4_;
              auVar56._28_4_ = auVar83._28_4_;
              auVar21 = vfmsub231ps_fma(auVar56,auVar95,auVar100);
              auVar78 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar79),ZEXT1632(auVar21));
              auVar98 = vfmadd231ps_avx512vl(ZEXT1632(auVar78),ZEXT1632(auVar20),auVar92);
              auVar100 = vrcp14ps_avx512vl(auVar98);
              auVar95 = auVar198._0_32_;
              auVar96 = vfnmadd213ps_avx512vl(auVar100,auVar98,auVar95);
              auVar78 = vfmadd132ps_fma(auVar96,auVar100,auVar100);
              auVar57._4_4_ = auVar21._4_4_ * auVar114._4_4_;
              auVar57._0_4_ = auVar21._0_4_ * auVar114._0_4_;
              auVar57._8_4_ = auVar21._8_4_ * auVar114._8_4_;
              auVar57._12_4_ = auVar21._12_4_ * auVar114._12_4_;
              auVar57._16_4_ = fVar128 * 0.0;
              auVar57._20_4_ = fVar138 * 0.0;
              auVar57._24_4_ = fVar151 * 0.0;
              auVar57._28_4_ = iVar1;
              auVar79 = vfmadd231ps_fma(auVar57,auVar88,ZEXT1632(auVar79));
              auVar79 = vfmadd231ps_fma(ZEXT1632(auVar79),auVar85,ZEXT1632(auVar20));
              fVar128 = auVar78._0_4_;
              fVar151 = auVar78._4_4_;
              fVar138 = auVar78._8_4_;
              fVar139 = auVar78._12_4_;
              local_380 = ZEXT1632(CONCAT412(auVar79._12_4_ * fVar139,
                                             CONCAT48(auVar79._8_4_ * fVar138,
                                                      CONCAT44(auVar79._4_4_ * fVar151,
                                                               auVar79._0_4_ * fVar128))));
              uVar140 = vcmpps_avx512vl(local_380,auVar190,2);
              auVar59._4_4_ = uStack_49c;
              auVar59._0_4_ = local_4a0;
              auVar59._8_4_ = uStack_498;
              auVar59._12_4_ = uStack_494;
              auVar59._16_4_ = uStack_490;
              auVar59._20_4_ = uStack_48c;
              auVar59._24_4_ = uStack_488;
              auVar59._28_4_ = uStack_484;
              uVar26 = vcmpps_avx512vl(local_380,auVar59,0xd);
              bVar71 = (byte)uVar140 & (byte)uVar26 & bVar71;
              if (bVar71 != 0) {
                uVar140 = vcmpps_avx512vl(auVar98,auVar92,4);
                bVar71 = bVar71 & (byte)uVar140;
                auVar197 = ZEXT3264(local_680);
                auVar196 = ZEXT3264(local_6a0);
                if (bVar71 != 0) {
                  fVar174 = auVar86._0_4_ * fVar128;
                  fVar173 = auVar86._4_4_ * fVar151;
                  auVar58._4_4_ = fVar173;
                  auVar58._0_4_ = fVar174;
                  fVar177 = auVar86._8_4_ * fVar138;
                  auVar58._8_4_ = fVar177;
                  fVar72 = auVar86._12_4_ * fVar139;
                  auVar58._12_4_ = fVar72;
                  fVar73 = auVar86._16_4_ * 0.0;
                  auVar58._16_4_ = fVar73;
                  fVar120 = auVar86._20_4_ * 0.0;
                  auVar58._20_4_ = fVar120;
                  fVar121 = auVar86._24_4_ * 0.0;
                  auVar58._24_4_ = fVar121;
                  auVar58._28_4_ = auVar98._28_4_;
                  auVar100 = vsubps_avx512vl(auVar95,auVar58);
                  local_3c0._0_4_ =
                       (float)((uint)(bVar61 & 1) * (int)fVar174 |
                              (uint)!(bool)(bVar61 & 1) * auVar100._0_4_);
                  bVar12 = (bool)((byte)(uVar62 >> 1) & 1);
                  local_3c0._4_4_ =
                       (float)((uint)bVar12 * (int)fVar173 | (uint)!bVar12 * auVar100._4_4_);
                  bVar12 = (bool)((byte)(uVar62 >> 2) & 1);
                  local_3c0._8_4_ =
                       (float)((uint)bVar12 * (int)fVar177 | (uint)!bVar12 * auVar100._8_4_);
                  bVar12 = (bool)((byte)(uVar62 >> 3) & 1);
                  local_3c0._12_4_ =
                       (float)((uint)bVar12 * (int)fVar72 | (uint)!bVar12 * auVar100._12_4_);
                  bVar12 = (bool)((byte)(uVar62 >> 4) & 1);
                  local_3c0._16_4_ =
                       (float)((uint)bVar12 * (int)fVar73 | (uint)!bVar12 * auVar100._16_4_);
                  bVar12 = (bool)((byte)(uVar62 >> 5) & 1);
                  local_3c0._20_4_ =
                       (float)((uint)bVar12 * (int)fVar120 | (uint)!bVar12 * auVar100._20_4_);
                  bVar12 = (bool)((byte)(uVar62 >> 6) & 1);
                  local_3c0._24_4_ =
                       (float)((uint)bVar12 * (int)fVar121 | (uint)!bVar12 * auVar100._24_4_);
                  bVar12 = SUB81(uVar62 >> 7,0);
                  local_3c0._28_4_ =
                       (float)((uint)bVar12 * auVar98._28_4_ | (uint)!bVar12 * auVar100._28_4_);
                  auVar98 = vsubps_avx(ZEXT1632(auVar77),auVar89);
                  auVar78 = vfmadd213ps_fma(auVar98,local_3c0,auVar89);
                  uVar129 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
                  auVar34._4_4_ = uVar129;
                  auVar34._0_4_ = uVar129;
                  auVar34._8_4_ = uVar129;
                  auVar34._12_4_ = uVar129;
                  auVar34._16_4_ = uVar129;
                  auVar34._20_4_ = uVar129;
                  auVar34._24_4_ = uVar129;
                  auVar34._28_4_ = uVar129;
                  auVar98 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar78._12_4_ + auVar78._12_4_,
                                                               CONCAT48(auVar78._8_4_ +
                                                                        auVar78._8_4_,
                                                                        CONCAT44(auVar78._4_4_ +
                                                                                 auVar78._4_4_,
                                                                                 auVar78._0_4_ +
                                                                                 auVar78._0_4_)))),
                                            auVar34);
                  uVar140 = vcmpps_avx512vl(local_380,auVar98,6);
                  if (((byte)uVar140 & bVar71) != 0) {
                    auVar145._0_4_ = auVar87._0_4_ * fVar128;
                    auVar145._4_4_ = auVar87._4_4_ * fVar151;
                    auVar145._8_4_ = auVar87._8_4_ * fVar138;
                    auVar145._12_4_ = auVar87._12_4_ * fVar139;
                    auVar145._16_4_ = auVar87._16_4_ * 0.0;
                    auVar145._20_4_ = auVar87._20_4_ * 0.0;
                    auVar145._24_4_ = auVar87._24_4_ * 0.0;
                    auVar145._28_4_ = 0;
                    auVar98 = vsubps_avx512vl(auVar95,auVar145);
                    auVar119._0_4_ =
                         (uint)(bVar61 & 1) * (int)auVar145._0_4_ |
                         (uint)!(bool)(bVar61 & 1) * auVar98._0_4_;
                    bVar12 = (bool)((byte)(uVar62 >> 1) & 1);
                    auVar119._4_4_ =
                         (uint)bVar12 * (int)auVar145._4_4_ | (uint)!bVar12 * auVar98._4_4_;
                    bVar12 = (bool)((byte)(uVar62 >> 2) & 1);
                    auVar119._8_4_ =
                         (uint)bVar12 * (int)auVar145._8_4_ | (uint)!bVar12 * auVar98._8_4_;
                    bVar12 = (bool)((byte)(uVar62 >> 3) & 1);
                    auVar119._12_4_ =
                         (uint)bVar12 * (int)auVar145._12_4_ | (uint)!bVar12 * auVar98._12_4_;
                    bVar12 = (bool)((byte)(uVar62 >> 4) & 1);
                    auVar119._16_4_ =
                         (uint)bVar12 * (int)auVar145._16_4_ | (uint)!bVar12 * auVar98._16_4_;
                    bVar12 = (bool)((byte)(uVar62 >> 5) & 1);
                    auVar119._20_4_ =
                         (uint)bVar12 * (int)auVar145._20_4_ | (uint)!bVar12 * auVar98._20_4_;
                    bVar12 = (bool)((byte)(uVar62 >> 6) & 1);
                    auVar119._24_4_ =
                         (uint)bVar12 * (int)auVar145._24_4_ | (uint)!bVar12 * auVar98._24_4_;
                    auVar119._28_4_ = (uint)!SUB81(uVar62 >> 7,0) * auVar98._28_4_;
                    auVar35._8_4_ = 0x40000000;
                    auVar35._0_8_ = 0x4000000040000000;
                    auVar35._12_4_ = 0x40000000;
                    auVar35._16_4_ = 0x40000000;
                    auVar35._20_4_ = 0x40000000;
                    auVar35._24_4_ = 0x40000000;
                    auVar35._28_4_ = 0x40000000;
                    local_3a0 = vfmsub132ps_avx512vl(auVar119,auVar95,auVar35);
                    local_360 = (undefined4)lVar69;
                    local_350 = local_630._0_8_;
                    uStack_348 = local_630._8_8_;
                    local_340 = local_640._0_8_;
                    uStack_338 = local_640._8_8_;
                    local_330 = local_650._0_8_;
                    uStack_328 = local_650._8_8_;
                    pGVar9 = (context->scene->geometries).items[uVar7].ptr;
                    if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                      bVar61 = 0;
                    }
                    else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                            (bVar61 = 1, pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                      auVar78 = vcvtsi2ss_avx512f(auVar198._0_16_,local_360);
                      fVar128 = auVar78._0_4_;
                      local_300[0] = (fVar128 + local_3c0._0_4_ + 0.0) * (float)local_400._0_4_;
                      local_300[1] = (fVar128 + local_3c0._4_4_ + 1.0) * (float)local_400._4_4_;
                      local_300[2] = (fVar128 + local_3c0._8_4_ + 2.0) * fStack_3f8;
                      local_300[3] = (fVar128 + local_3c0._12_4_ + 3.0) * fStack_3f4;
                      fStack_2f0 = (fVar128 + local_3c0._16_4_ + 4.0) * fStack_3f0;
                      fStack_2ec = (fVar128 + local_3c0._20_4_ + 5.0) * fStack_3ec;
                      fStack_2e8 = (fVar128 + local_3c0._24_4_ + 6.0) * fStack_3e8;
                      fStack_2e4 = fVar128 + local_3c0._28_4_ + 7.0;
                      local_2e0 = local_3a0;
                      local_2c0 = local_380;
                      lVar63 = 0;
                      uVar67 = (ulong)((byte)uVar140 & bVar71);
                      for (uVar62 = uVar67; (uVar62 & 1) == 0;
                          uVar62 = uVar62 >> 1 | 0x8000000000000000) {
                        lVar63 = lVar63 + 1;
                      }
                      local_4e0._0_4_ = (int)uVar65;
                      local_2a0 = auVar190;
                      local_35c = iVar8;
                      do {
                        auVar79 = auVar199._0_16_;
                        local_200 = local_300[lVar63];
                        local_420._0_8_ = lVar63;
                        local_1e0 = *(undefined4 *)(local_2e0 + lVar63 * 4);
                        *(undefined4 *)(ray + k * 4 + 0x100) =
                             *(undefined4 *)(local_2c0 + lVar63 * 4);
                        local_6d0.context = context->user;
                        fVar151 = 1.0 - local_200;
                        fVar128 = fVar151 * fVar151 * -3.0;
                        auVar78 = vfmadd231ss_fma(ZEXT416((uint)(fVar151 * fVar151)),
                                                  ZEXT416((uint)(local_200 * fVar151)),
                                                  ZEXT416(0xc0000000));
                        auVar77 = vfmsub132ss_fma(ZEXT416((uint)(local_200 * fVar151)),
                                                  ZEXT416((uint)(local_200 * local_200)),
                                                  ZEXT416(0x40000000));
                        fVar151 = auVar78._0_4_ * 3.0;
                        fVar138 = auVar77._0_4_ * 3.0;
                        fVar139 = local_200 * local_200 * 3.0;
                        auVar170._0_4_ = fVar139 * (float)local_4b0._0_4_;
                        auVar170._4_4_ = fVar139 * (float)local_4b0._4_4_;
                        auVar170._8_4_ = fVar139 * fStack_4a8;
                        auVar170._12_4_ = fVar139 * fStack_4a4;
                        auVar136._4_4_ = fVar138;
                        auVar136._0_4_ = fVar138;
                        auVar136._8_4_ = fVar138;
                        auVar136._12_4_ = fVar138;
                        auVar78 = vfmadd132ps_fma(auVar136,auVar170,local_650);
                        auVar155._4_4_ = fVar151;
                        auVar155._0_4_ = fVar151;
                        auVar155._8_4_ = fVar151;
                        auVar155._12_4_ = fVar151;
                        auVar78 = vfmadd132ps_fma(auVar155,auVar78,local_640);
                        auVar137._4_4_ = fVar128;
                        auVar137._0_4_ = fVar128;
                        auVar137._8_4_ = fVar128;
                        auVar137._12_4_ = fVar128;
                        auVar78 = vfmadd132ps_fma(auVar137,auVar78,local_630);
                        local_260 = auVar78._0_4_;
                        auVar165._8_4_ = 1;
                        auVar165._0_8_ = 0x100000001;
                        auVar165._12_4_ = 1;
                        auVar165._16_4_ = 1;
                        auVar165._20_4_ = 1;
                        auVar165._24_4_ = 1;
                        auVar165._28_4_ = 1;
                        local_240 = vpermps_avx2(auVar165,ZEXT1632(auVar78));
                        auVar172._8_4_ = 2;
                        auVar172._0_8_ = 0x200000002;
                        auVar172._12_4_ = 2;
                        auVar172._16_4_ = 2;
                        auVar172._20_4_ = 2;
                        auVar172._24_4_ = 2;
                        auVar172._28_4_ = 2;
                        local_220 = vpermps_avx2(auVar172,ZEXT1632(auVar78));
                        uStack_25c = local_260;
                        uStack_258 = local_260;
                        uStack_254 = local_260;
                        uStack_250 = local_260;
                        uStack_24c = local_260;
                        uStack_248 = local_260;
                        uStack_244 = local_260;
                        fStack_1fc = local_200;
                        fStack_1f8 = local_200;
                        fStack_1f4 = local_200;
                        fStack_1f0 = local_200;
                        fStack_1ec = local_200;
                        fStack_1e8 = local_200;
                        fStack_1e4 = local_200;
                        uStack_1dc = local_1e0;
                        uStack_1d8 = local_1e0;
                        uStack_1d4 = local_1e0;
                        uStack_1d0 = local_1e0;
                        uStack_1cc = local_1e0;
                        uStack_1c8 = local_1e0;
                        uStack_1c4 = local_1e0;
                        local_1c0 = local_440._0_8_;
                        uStack_1b8 = local_440._8_8_;
                        uStack_1b0 = local_440._16_8_;
                        uStack_1a8 = local_440._24_8_;
                        local_1a0 = local_460;
                        vpcmpeqd_avx2(local_460,local_460);
                        local_180 = (local_6d0.context)->instID[0];
                        uStack_17c = local_180;
                        uStack_178 = local_180;
                        uStack_174 = local_180;
                        uStack_170 = local_180;
                        uStack_16c = local_180;
                        uStack_168 = local_180;
                        uStack_164 = local_180;
                        local_160 = (local_6d0.context)->instPrimID[0];
                        uStack_15c = local_160;
                        uStack_158 = local_160;
                        uStack_154 = local_160;
                        uStack_150 = local_160;
                        uStack_14c = local_160;
                        uStack_148 = local_160;
                        uStack_144 = local_160;
                        local_5a0 = local_280;
                        local_6d0.valid = (int *)local_5a0;
                        local_6d0.geometryUserPtr = pGVar9->userPtr;
                        local_6d0.hit = (RTCHitN *)&local_260;
                        local_6d0.N = 8;
                        local_6d0.ray = (RTCRayN *)ray;
                        if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar9->occlusionFilterN)(&local_6d0);
                          auVar194 = ZEXT3264(local_2a0);
                          uVar65 = (ulong)(uint)local_4e0._0_4_;
                          auVar196 = ZEXT3264(local_6a0);
                          auVar197 = ZEXT3264(local_680);
                          auVar201 = ZEXT3264(local_520);
                          auVar200 = ZEXT3264(local_500);
                          auVar78 = vxorps_avx512vl(auVar79,auVar79);
                          auVar199 = ZEXT1664(auVar78);
                        }
                        auVar78 = auVar199._0_16_;
                        if (local_5a0 == (undefined1  [32])0x0) {
                          auVar98 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar198 = ZEXT3264(auVar98);
                          auVar205 = ZEXT3264(local_5c0);
                          auVar202 = ZEXT3264(local_5e0);
                          auVar203 = ZEXT3264(local_600);
                          auVar204 = ZEXT3264(local_620);
                        }
                        else {
                          p_Var11 = context->args->filter;
                          if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var11)(&local_6d0);
                            auVar194 = ZEXT3264(local_2a0);
                            uVar65 = (ulong)(uint)local_4e0._0_4_;
                            auVar196 = ZEXT3264(local_6a0);
                            auVar197 = ZEXT3264(local_680);
                            auVar201 = ZEXT3264(local_520);
                            auVar200 = ZEXT3264(local_500);
                            auVar78 = vxorps_avx512vl(auVar78,auVar78);
                            auVar199 = ZEXT1664(auVar78);
                          }
                          uVar62 = vptestmd_avx512vl(local_5a0,local_5a0);
                          auVar98 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                          bVar12 = (bool)((byte)uVar62 & 1);
                          bVar13 = (bool)((byte)(uVar62 >> 1) & 1);
                          bVar14 = (bool)((byte)(uVar62 >> 2) & 1);
                          bVar15 = (bool)((byte)(uVar62 >> 3) & 1);
                          bVar16 = (bool)((byte)(uVar62 >> 4) & 1);
                          bVar17 = (bool)((byte)(uVar62 >> 5) & 1);
                          bVar18 = (bool)((byte)(uVar62 >> 6) & 1);
                          bVar19 = SUB81(uVar62 >> 7,0);
                          *(uint *)(local_6d0.ray + 0x100) =
                               (uint)bVar12 * auVar98._0_4_ |
                               (uint)!bVar12 * *(int *)(local_6d0.ray + 0x100);
                          *(uint *)(local_6d0.ray + 0x104) =
                               (uint)bVar13 * auVar98._4_4_ |
                               (uint)!bVar13 * *(int *)(local_6d0.ray + 0x104);
                          *(uint *)(local_6d0.ray + 0x108) =
                               (uint)bVar14 * auVar98._8_4_ |
                               (uint)!bVar14 * *(int *)(local_6d0.ray + 0x108);
                          *(uint *)(local_6d0.ray + 0x10c) =
                               (uint)bVar15 * auVar98._12_4_ |
                               (uint)!bVar15 * *(int *)(local_6d0.ray + 0x10c);
                          *(uint *)(local_6d0.ray + 0x110) =
                               (uint)bVar16 * auVar98._16_4_ |
                               (uint)!bVar16 * *(int *)(local_6d0.ray + 0x110);
                          *(uint *)(local_6d0.ray + 0x114) =
                               (uint)bVar17 * auVar98._20_4_ |
                               (uint)!bVar17 * *(int *)(local_6d0.ray + 0x114);
                          *(uint *)(local_6d0.ray + 0x118) =
                               (uint)bVar18 * auVar98._24_4_ |
                               (uint)!bVar18 * *(int *)(local_6d0.ray + 0x118);
                          *(uint *)(local_6d0.ray + 0x11c) =
                               (uint)bVar19 * auVar98._28_4_ |
                               (uint)!bVar19 * *(int *)(local_6d0.ray + 0x11c);
                          auVar98 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar198 = ZEXT3264(auVar98);
                          auVar205 = ZEXT3264(local_5c0);
                          auVar202 = ZEXT3264(local_5e0);
                          auVar203 = ZEXT3264(local_600);
                          auVar204 = ZEXT3264(local_620);
                          if (local_5a0 != (undefined1  [32])0x0) {
                            bVar61 = 1;
                            break;
                          }
                        }
                        *(int *)(ray + k * 4 + 0x100) = auVar194._0_4_;
                        bVar61 = 0;
                        lVar63 = 0;
                        uVar67 = uVar67 ^ 1L << (local_420._0_8_ & 0x3f);
                        for (uVar62 = uVar67; (uVar62 & 1) == 0;
                            uVar62 = uVar62 >> 1 | 0x8000000000000000) {
                          lVar63 = lVar63 + 1;
                        }
                      } while (uVar67 != 0);
                    }
                    uVar65 = CONCAT71((int7)(uVar65 >> 8),(byte)uVar65 | bVar61);
                  }
                }
                goto LAB_01b82c51;
              }
            }
            auVar197 = ZEXT3264(local_680);
            auVar196 = ZEXT3264(local_6a0);
          }
LAB_01b82c51:
          lVar69 = lVar69 + 8;
        } while ((int)lVar69 < iVar8);
      }
      bVar71 = (byte)uVar65;
      if ((uVar65 & 1) != 0) break;
      uVar129 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar32._4_4_ = uVar129;
      auVar32._0_4_ = uVar129;
      auVar32._8_4_ = uVar129;
      auVar32._12_4_ = uVar129;
      uVar140 = vcmpps_avx512vl(local_3d0,auVar32,2);
      uVar68 = (uint)uVar70 & (uint)uVar70 + 0xf & (uint)uVar140;
      uVar70 = (ulong)uVar68;
    } while (uVar68 != 0);
  }
  return (bool)(bVar71 & 1);
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }